

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx2::CurveNiIntersectorK<4,8>::
     occluded_t<embree::avx2::SweepCurve1IntersectorK<embree::CatmullRomCurveT,8>,embree::avx2::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  undefined8 uVar1;
  Primitive PVar2;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  bool bVar55;
  bool bVar56;
  undefined1 auVar57 [12];
  bool bVar58;
  bool bVar59;
  bool bVar60;
  bool bVar61;
  bool bVar62;
  bool bVar63;
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  uint uVar96;
  int iVar97;
  ulong uVar98;
  ulong uVar99;
  byte unaff_BL;
  long lVar100;
  uint uVar101;
  undefined4 uVar102;
  ulong uVar103;
  ulong uVar104;
  float fVar105;
  float fVar106;
  float fVar133;
  float fVar134;
  vint4 bi_2;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 extraout_var [60];
  undefined1 auVar131 [64];
  undefined1 extraout_var_00 [60];
  undefined1 auVar132 [64];
  undefined8 extraout_XMM1_Qa;
  vint4 bi_1;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined8 extraout_XMM1_Qa_00;
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar183 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [64];
  undefined1 auVar190 [64];
  float fVar191;
  vint4 ai_2;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  vint4 ai;
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  float fVar220;
  float fVar221;
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  float fVar222;
  float fVar231;
  float fVar232;
  vint4 bi;
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  float fVar233;
  float fVar234;
  float fVar235;
  float fVar236;
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  float fVar239;
  undefined1 auVar237 [16];
  float fVar240;
  undefined1 auVar238 [32];
  float fVar241;
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  float fVar250;
  float fVar251;
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  float fVar252;
  float fVar253;
  float fVar254;
  float fVar255;
  float fVar256;
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  float fVar257;
  float fVar270;
  float fVar271;
  vint4 ai_1;
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  float fVar272;
  float fVar273;
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar269 [64];
  float s;
  undefined1 auVar274 [16];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  float t;
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar281 [32];
  undefined1 auVar294 [32];
  float fVar286;
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  float fVar287;
  float fVar288;
  float fVar289;
  float fVar290;
  undefined1 auVar284 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar299 [32];
  undefined1 auVar300 [64];
  float fVar301;
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  float fVar307;
  float fVar308;
  float fVar309;
  float fVar310;
  float fVar311;
  float fVar312;
  undefined1 auVar306 [64];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [28];
  undefined1 auVar316 [32];
  undefined1 auVar317 [32];
  float fVar318;
  float fVar319;
  float fVar320;
  float fVar321;
  float fVar322;
  float fVar323;
  float fVar324;
  RTCFilterFunctionNArguments args;
  float P_err;
  Vec3fa dir;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp0;
  vboolx_conflict valid;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  bool local_ca9;
  undefined1 local_ca0 [32];
  float local_b80;
  float fStack_b3c;
  float fStack_b38;
  float fStack_b34;
  undefined4 local_ac0;
  RTCFilterFunctionNArguments local_a90;
  undefined1 local_a60 [32];
  undefined1 local_a40 [8];
  float fStack_a38;
  float fStack_a34;
  float fStack_a30;
  float fStack_a2c;
  float fStack_a28;
  undefined1 local_a20 [32];
  undefined1 local_a00 [16];
  undefined1 local_9f0 [16];
  undefined1 local_9e0 [8];
  float fStack_9d8;
  float fStack_9d4;
  undefined1 auStack_9d0 [16];
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined1 local_990 [16];
  undefined1 local_980 [16];
  Primitive *local_970;
  ulong local_968;
  undefined1 local_960 [8];
  float fStack_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float fStack_948;
  undefined1 local_940 [32];
  undefined1 local_920 [8];
  float fStack_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float fStack_908;
  float fStack_904;
  undefined4 local_900;
  undefined4 uStack_8fc;
  undefined4 uStack_8f8;
  undefined4 uStack_8f4;
  undefined4 uStack_8f0;
  undefined4 uStack_8ec;
  undefined4 uStack_8e8;
  undefined4 uStack_8e4;
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  undefined1 local_8c0 [8];
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  float fStack_8a4;
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  undefined1 local_880 [32];
  undefined1 local_860 [16];
  undefined1 auStack_850 [16];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  uint local_7e0;
  uint uStack_7dc;
  uint uStack_7d8;
  uint uStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  uint uStack_7c4;
  undefined1 local_7c0 [32];
  ulong local_7a0;
  undefined1 auStack_798 [24];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_630 [16];
  undefined1 local_620 [32];
  uint local_600;
  uint uStack_5fc;
  uint uStack_5f8;
  uint uStack_5f4;
  uint uStack_5f0;
  uint uStack_5ec;
  uint uStack_5e8;
  uint uStack_5e4;
  uint local_5e0;
  uint uStack_5dc;
  uint uStack_5d8;
  uint uStack_5d4;
  uint uStack_5d0;
  uint uStack_5cc;
  uint uStack_5c8;
  uint uStack_5c4;
  undefined1 local_5c0 [32];
  undefined4 local_5a0;
  undefined4 uStack_59c;
  undefined4 uStack_598;
  undefined4 uStack_594;
  undefined4 uStack_590;
  undefined4 uStack_58c;
  undefined4 uStack_588;
  undefined4 uStack_584;
  undefined4 local_580;
  undefined4 uStack_57c;
  undefined4 uStack_578;
  undefined4 uStack_574;
  undefined4 uStack_570;
  undefined4 uStack_56c;
  undefined4 uStack_568;
  undefined4 uStack_564;
  undefined4 local_560;
  undefined4 uStack_55c;
  undefined4 uStack_558;
  undefined4 uStack_554;
  undefined4 uStack_550;
  undefined4 uStack_54c;
  undefined4 uStack_548;
  undefined4 uStack_544;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined4 local_3a0;
  undefined4 uStack_39c;
  undefined4 uStack_398;
  undefined4 uStack_394;
  undefined4 uStack_390;
  undefined4 uStack_38c;
  undefined4 uStack_388;
  undefined4 uStack_384;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined1 local_320 [32];
  uint local_300;
  uint uStack_2fc;
  uint uStack_2f8;
  uint uStack_2f4;
  uint uStack_2f0;
  uint uStack_2ec;
  uint uStack_2e8;
  uint uStack_2e4;
  uint local_2e0;
  uint uStack_2dc;
  uint uStack_2d8;
  uint uStack_2d4;
  uint uStack_2d0;
  uint uStack_2cc;
  uint uStack_2c8;
  uint uStack_2c4;
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  undefined1 extraout_var_01 [56];
  undefined1 auVar166 [64];
  undefined1 auVar167 [64];
  undefined1 auVar280 [32];
  undefined1 auVar285 [64];
  undefined1 auVar291 [16];
  
  PVar2 = prim[1];
  uVar99 = (ulong)(byte)PVar2;
  auVar5 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x10
                        );
  auVar5 = vinsertps_avx(auVar5,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar6 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                         ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar6 = vinsertps_avx(auVar6,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  fVar105 = *(float *)(prim + uVar99 * 0x19 + 0x12);
  auVar5 = vsubps_avx(auVar5,*(undefined1 (*) [16])(prim + uVar99 * 0x19 + 6));
  auVar107._0_4_ = fVar105 * auVar5._0_4_;
  auVar107._4_4_ = fVar105 * auVar5._4_4_;
  auVar107._8_4_ = fVar105 * auVar5._8_4_;
  auVar107._12_4_ = fVar105 * auVar5._12_4_;
  auVar223._0_4_ = fVar105 * auVar6._0_4_;
  auVar223._4_4_ = fVar105 * auVar6._4_4_;
  auVar223._8_4_ = fVar105 * auVar6._8_4_;
  auVar223._12_4_ = fVar105 * auVar6._12_4_;
  auVar5 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar99 * 4 + 6)));
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar6 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar99 * 5 + 6)));
  auVar6 = vcvtdq2ps_avx(auVar6);
  auVar7 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar99 * 6 + 6)));
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar8 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar99 * 0xb + 6)));
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar2 * 0xc) + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar2 * 0xc + uVar99 + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  uVar103 = (ulong)(uint)((int)(uVar99 * 9) * 2);
  auVar110 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar103 + 6)));
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar109 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar103 + uVar99 + 6)));
  auVar109 = vcvtdq2ps_avx(auVar109);
  uVar103 = (ulong)(uint)((int)(uVar99 * 5) << 2);
  auVar168 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar103 + 6)));
  auVar168 = vcvtdq2ps_avx(auVar168);
  auVar313._4_4_ = auVar223._0_4_;
  auVar313._0_4_ = auVar223._0_4_;
  auVar313._8_4_ = auVar223._0_4_;
  auVar313._12_4_ = auVar223._0_4_;
  auVar136 = vshufps_avx(auVar223,auVar223,0x55);
  auVar108 = vshufps_avx(auVar223,auVar223,0xaa);
  fVar105 = auVar108._0_4_;
  auVar282._0_4_ = fVar105 * auVar7._0_4_;
  fVar133 = auVar108._4_4_;
  auVar282._4_4_ = fVar133 * auVar7._4_4_;
  fVar134 = auVar108._8_4_;
  auVar282._8_4_ = fVar134 * auVar7._8_4_;
  fVar273 = auVar108._12_4_;
  auVar282._12_4_ = fVar273 * auVar7._12_4_;
  auVar278._0_4_ = auVar10._0_4_ * fVar105;
  auVar278._4_4_ = auVar10._4_4_ * fVar133;
  auVar278._8_4_ = auVar10._8_4_ * fVar134;
  auVar278._12_4_ = auVar10._12_4_ * fVar273;
  auVar258._0_4_ = auVar168._0_4_ * fVar105;
  auVar258._4_4_ = auVar168._4_4_ * fVar133;
  auVar258._8_4_ = auVar168._8_4_ * fVar134;
  auVar258._12_4_ = auVar168._12_4_ * fVar273;
  auVar108 = vfmadd231ps_fma(auVar282,auVar136,auVar6);
  auVar116 = vfmadd231ps_fma(auVar278,auVar136,auVar9);
  auVar136 = vfmadd231ps_fma(auVar258,auVar109,auVar136);
  auVar145 = vfmadd231ps_fma(auVar108,auVar313,auVar5);
  auVar116 = vfmadd231ps_fma(auVar116,auVar313,auVar8);
  auVar212 = vfmadd231ps_fma(auVar136,auVar110,auVar313);
  auVar314._4_4_ = auVar107._0_4_;
  auVar314._0_4_ = auVar107._0_4_;
  auVar314._8_4_ = auVar107._0_4_;
  auVar314._12_4_ = auVar107._0_4_;
  auVar136 = vshufps_avx(auVar107,auVar107,0x55);
  auVar108 = vshufps_avx(auVar107,auVar107,0xaa);
  fVar105 = auVar108._0_4_;
  auVar224._0_4_ = fVar105 * auVar7._0_4_;
  fVar133 = auVar108._4_4_;
  auVar224._4_4_ = fVar133 * auVar7._4_4_;
  fVar134 = auVar108._8_4_;
  auVar224._8_4_ = fVar134 * auVar7._8_4_;
  fVar273 = auVar108._12_4_;
  auVar224._12_4_ = fVar273 * auVar7._12_4_;
  auVar135._0_4_ = auVar10._0_4_ * fVar105;
  auVar135._4_4_ = auVar10._4_4_ * fVar133;
  auVar135._8_4_ = auVar10._8_4_ * fVar134;
  auVar135._12_4_ = auVar10._12_4_ * fVar273;
  auVar108._0_4_ = auVar168._0_4_ * fVar105;
  auVar108._4_4_ = auVar168._4_4_ * fVar133;
  auVar108._8_4_ = auVar168._8_4_ * fVar134;
  auVar108._12_4_ = auVar168._12_4_ * fVar273;
  auVar6 = vfmadd231ps_fma(auVar224,auVar136,auVar6);
  auVar7 = vfmadd231ps_fma(auVar135,auVar136,auVar9);
  auVar9 = vfmadd231ps_fma(auVar108,auVar136,auVar109);
  auVar10 = vfmadd231ps_fma(auVar6,auVar314,auVar5);
  auVar109 = vfmadd231ps_fma(auVar7,auVar314,auVar8);
  auVar168 = vfmadd231ps_fma(auVar9,auVar314,auVar110);
  auVar242._8_4_ = 0x7fffffff;
  auVar242._0_8_ = 0x7fffffff7fffffff;
  auVar242._12_4_ = 0x7fffffff;
  auVar5 = vandps_avx(auVar145,auVar242);
  auVar211._8_4_ = 0x219392ef;
  auVar211._0_8_ = 0x219392ef219392ef;
  auVar211._12_4_ = 0x219392ef;
  auVar5 = vcmpps_avx(auVar5,auVar211,1);
  auVar6 = vblendvps_avx(auVar145,auVar211,auVar5);
  auVar5 = vandps_avx(auVar116,auVar242);
  auVar5 = vcmpps_avx(auVar5,auVar211,1);
  auVar7 = vblendvps_avx(auVar116,auVar211,auVar5);
  auVar5 = vandps_avx(auVar212,auVar242);
  auVar5 = vcmpps_avx(auVar5,auVar211,1);
  auVar5 = vblendvps_avx(auVar212,auVar211,auVar5);
  auVar8 = vrcpps_avx(auVar6);
  auVar243._8_4_ = 0x3f800000;
  auVar243._0_8_ = &DAT_3f8000003f800000;
  auVar243._12_4_ = 0x3f800000;
  auVar6 = vfnmadd213ps_fma(auVar6,auVar8,auVar243);
  auVar8 = vfmadd132ps_fma(auVar6,auVar8,auVar8);
  auVar6 = vrcpps_avx(auVar7);
  auVar7 = vfnmadd213ps_fma(auVar7,auVar6,auVar243);
  auVar9 = vfmadd132ps_fma(auVar7,auVar6,auVar6);
  auVar6 = vrcpps_avx(auVar5);
  auVar7 = vfnmadd213ps_fma(auVar5,auVar6,auVar243);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar99 * 7 + 6);
  auVar5 = vpmovsxwd_avx(auVar5);
  auVar110 = vfmadd132ps_fma(auVar7,auVar6,auVar6);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar10);
  auVar212._0_4_ = auVar8._0_4_ * auVar5._0_4_;
  auVar212._4_4_ = auVar8._4_4_ * auVar5._4_4_;
  auVar212._8_4_ = auVar8._8_4_ * auVar5._8_4_;
  auVar212._12_4_ = auVar8._12_4_ * auVar5._12_4_;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar99 * 9 + 6);
  auVar5 = vpmovsxwd_avx(auVar6);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar10);
  auVar225._0_4_ = auVar8._0_4_ * auVar5._0_4_;
  auVar225._4_4_ = auVar8._4_4_ * auVar5._4_4_;
  auVar225._8_4_ = auVar8._8_4_ * auVar5._8_4_;
  auVar225._12_4_ = auVar8._12_4_ * auVar5._12_4_;
  auVar116._1_3_ = 0;
  auVar116[0] = PVar2;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar2 * 0x10 + 6);
  auVar6 = vpmovsxwd_avx(auVar7);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar2 * 0x10 + uVar99 * -2 + 6);
  auVar5 = vpmovsxwd_avx(auVar8);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar109);
  auVar259._0_4_ = auVar5._0_4_ * auVar9._0_4_;
  auVar259._4_4_ = auVar5._4_4_ * auVar9._4_4_;
  auVar259._8_4_ = auVar5._8_4_ * auVar9._8_4_;
  auVar259._12_4_ = auVar5._12_4_ * auVar9._12_4_;
  auVar5 = vcvtdq2ps_avx(auVar6);
  auVar5 = vsubps_avx(auVar5,auVar109);
  auVar136._0_4_ = auVar9._0_4_ * auVar5._0_4_;
  auVar136._4_4_ = auVar9._4_4_ * auVar5._4_4_;
  auVar136._8_4_ = auVar9._8_4_ * auVar5._8_4_;
  auVar136._12_4_ = auVar9._12_4_ * auVar5._12_4_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar103 + uVar99 + 6);
  auVar5 = vpmovsxwd_avx(auVar9);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar168);
  auVar145._0_4_ = auVar110._0_4_ * auVar5._0_4_;
  auVar145._4_4_ = auVar110._4_4_ * auVar5._4_4_;
  auVar145._8_4_ = auVar110._8_4_ * auVar5._8_4_;
  auVar145._12_4_ = auVar110._12_4_ * auVar5._12_4_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar99 * 0x17 + 6);
  auVar5 = vpmovsxwd_avx(auVar10);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar168);
  auVar109._0_4_ = auVar110._0_4_ * auVar5._0_4_;
  auVar109._4_4_ = auVar110._4_4_ * auVar5._4_4_;
  auVar109._8_4_ = auVar110._8_4_ * auVar5._8_4_;
  auVar109._12_4_ = auVar110._12_4_ * auVar5._12_4_;
  auVar5 = vpminsd_avx(auVar212,auVar225);
  auVar6 = vpminsd_avx(auVar259,auVar136);
  auVar5 = vmaxps_avx(auVar5,auVar6);
  auVar6 = vpminsd_avx(auVar145,auVar109);
  uVar102 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar274._4_4_ = uVar102;
  auVar274._0_4_ = uVar102;
  auVar274._8_4_ = uVar102;
  auVar274._12_4_ = uVar102;
  auVar6 = vmaxps_avx(auVar6,auVar274);
  auVar5 = vmaxps_avx(auVar5,auVar6);
  local_630._0_4_ = auVar5._0_4_ * 0.99999964;
  local_630._4_4_ = auVar5._4_4_ * 0.99999964;
  local_630._8_4_ = auVar5._8_4_ * 0.99999964;
  local_630._12_4_ = auVar5._12_4_ * 0.99999964;
  auVar5 = vpmaxsd_avx(auVar212,auVar225);
  auVar6 = vpmaxsd_avx(auVar259,auVar136);
  auVar5 = vminps_avx(auVar5,auVar6);
  auVar6 = vpmaxsd_avx(auVar145,auVar109);
  uVar102 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar168._4_4_ = uVar102;
  auVar168._0_4_ = uVar102;
  auVar168._8_4_ = uVar102;
  auVar168._12_4_ = uVar102;
  auVar6 = vminps_avx(auVar6,auVar168);
  auVar5 = vminps_avx(auVar5,auVar6);
  auVar110._0_4_ = auVar5._0_4_ * 1.0000004;
  auVar110._4_4_ = auVar5._4_4_ * 1.0000004;
  auVar110._8_4_ = auVar5._8_4_ * 1.0000004;
  auVar110._12_4_ = auVar5._12_4_ * 1.0000004;
  auVar116[4] = PVar2;
  auVar116._5_3_ = 0;
  auVar116[8] = PVar2;
  auVar116._9_3_ = 0;
  auVar116[0xc] = PVar2;
  auVar116._13_3_ = 0;
  auVar6 = vpcmpgtd_avx(auVar116,_DAT_01ff0cf0);
  auVar5 = vcmpps_avx(local_630,auVar110,2);
  auVar5 = vandps_avx(auVar5,auVar6);
  uVar96 = vmovmskps_avx(auVar5);
  local_ca9 = uVar96 != 0;
  if (uVar96 == 0) {
    return local_ca9;
  }
  uVar96 = uVar96 & 0xff;
  auVar217._16_16_ = mm_lookupmask_ps._240_16_;
  auVar217._0_16_ = mm_lookupmask_ps._240_16_;
  local_220 = vblendps_avx(auVar217,ZEXT832(0) << 0x20,0x80);
  iVar97 = 1 << ((uint)k & 0x1f);
  auVar121._4_4_ = iVar97;
  auVar121._0_4_ = iVar97;
  auVar121._8_4_ = iVar97;
  auVar121._12_4_ = iVar97;
  auVar121._16_4_ = iVar97;
  auVar121._20_4_ = iVar97;
  auVar121._24_4_ = iVar97;
  auVar121._28_4_ = iVar97;
  auVar229 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar217 = vpand_avx2(auVar121,auVar229);
  local_620 = vpcmpeqd_avx2(auVar217,auVar229);
  local_900 = 0x7fffffff;
  uStack_8fc = 0x7fffffff;
  uStack_8f8 = 0x7fffffff;
  uStack_8f4 = 0x7fffffff;
  uStack_8f0 = 0x7fffffff;
  uStack_8ec = 0x7fffffff;
  uStack_8e8 = 0x7fffffff;
  uStack_8e4 = 0x7fffffff;
  local_7e0 = 0x80000000;
  uStack_7dc = 0x80000000;
  uStack_7d8 = 0x80000000;
  uStack_7d4 = 0x80000000;
  fStack_7d0 = -0.0;
  fStack_7cc = -0.0;
  fStack_7c8 = -0.0;
  uStack_7c4 = 0x80000000;
  local_970 = prim;
LAB_016c02da:
  lVar100 = 0;
  local_968 = (ulong)uVar96;
  for (uVar103 = local_968; (uVar103 & 1) == 0; uVar103 = uVar103 >> 1 | 0x8000000000000000) {
    lVar100 = lVar100 + 1;
  }
  uVar96 = *(uint *)(local_970 + 2);
  local_600 = *(uint *)(local_970 + lVar100 * 4 + 6);
  pGVar3 = (context->scene->geometries).items[uVar96].ptr;
  uVar103 = (ulong)*(uint *)(*(long *)&pGVar3->field_0x58 +
                            pGVar3[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                            _M_i * (ulong)local_600);
  p_Var4 = pGVar3[1].intersectionFilterN;
  lVar100 = *(long *)&pGVar3[1].time_range.upper;
  auVar5 = *(undefined1 (*) [16])(lVar100 + (long)p_Var4 * uVar103);
  auVar6 = *(undefined1 (*) [16])(lVar100 + (uVar103 + 1) * (long)p_Var4);
  local_968 = local_968 - 1 & local_968;
  if (local_968 != 0) {
    uVar104 = local_968 - 1 & local_968;
    for (uVar99 = local_968; (uVar99 & 1) == 0; uVar99 = uVar99 >> 1 | 0x8000000000000000) {
    }
    if (uVar104 != 0) {
      for (; (uVar104 & 1) == 0; uVar104 = uVar104 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar7 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x1c
                        );
  auVar8 = vinsertps_avx(auVar7,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  fVar105 = *(float *)(ray + k * 4 + 0x80);
  auVar279._4_4_ = fVar105;
  auVar279._0_4_ = fVar105;
  auVar279._8_4_ = fVar105;
  auVar279._12_4_ = fVar105;
  auVar280._16_4_ = fVar105;
  auVar280._0_16_ = auVar279;
  auVar280._20_4_ = fVar105;
  auVar280._24_4_ = fVar105;
  auVar280._28_4_ = fVar105;
  uVar102 = *(undefined4 *)(ray + k * 4 + 0xa0);
  auVar283._4_4_ = uVar102;
  auVar283._0_4_ = uVar102;
  auVar283._8_4_ = uVar102;
  auVar283._12_4_ = uVar102;
  fStack_8d0 = (float)uVar102;
  _local_8e0 = auVar283;
  fStack_8cc = (float)uVar102;
  fStack_8c8 = (float)uVar102;
  register0x000014dc = uVar102;
  auVar285 = ZEXT3264(_local_8e0);
  auVar7 = vunpcklps_avx(auVar279,auVar283);
  fVar133 = *(float *)(ray + k * 4 + 0xc0);
  auVar291._4_4_ = fVar133;
  auVar291._0_4_ = fVar133;
  auVar291._8_4_ = fVar133;
  auVar291._12_4_ = fVar133;
  fStack_a30 = fVar133;
  _local_a40 = auVar291;
  fStack_a2c = fVar133;
  fStack_a28 = fVar133;
  register0x0000151c = fVar133;
  auVar300 = ZEXT3264(_local_a40);
  local_9f0 = vinsertps_avx(auVar7,auVar291,0x28);
  auVar269 = ZEXT1664(local_9f0);
  auVar226._0_4_ = (auVar5._0_4_ + auVar6._0_4_) * 0.5;
  auVar226._4_4_ = (auVar5._4_4_ + auVar6._4_4_) * 0.5;
  auVar226._8_4_ = (auVar5._8_4_ + auVar6._8_4_) * 0.5;
  auVar226._12_4_ = (auVar5._12_4_ + auVar6._12_4_) * 0.5;
  auVar7 = vsubps_avx(auVar226,auVar8);
  auVar7 = vdpps_avx(auVar7,local_9f0,0x7f);
  local_a00 = vdpps_avx(local_9f0,local_9f0,0x7f);
  auVar306 = ZEXT1664(local_a00);
  auVar9 = vrcpss_avx(local_a00,local_a00);
  auVar10 = vfnmadd213ss_fma(auVar9,local_a00,ZEXT416(0x40000000));
  fVar134 = auVar7._0_4_ * auVar9._0_4_ * auVar10._0_4_;
  auVar237._4_4_ = fVar134;
  auVar237._0_4_ = fVar134;
  auVar237._8_4_ = fVar134;
  auVar237._12_4_ = fVar134;
  auVar7 = vfmadd231ps_fma(auVar8,local_9f0,auVar237);
  auVar7 = vblendps_avx(auVar7,_DAT_01feba10,8);
  auVar8 = vsubps_avx(auVar5,auVar7);
  auVar9 = vsubps_avx(*(undefined1 (*) [16])(lVar100 + (uVar103 + 2) * (long)p_Var4),auVar7);
  auVar10 = vsubps_avx(auVar6,auVar7);
  auVar7 = vsubps_avx(*(undefined1 (*) [16])(lVar100 + (uVar103 + 3) * (long)p_Var4),auVar7);
  auVar5 = vmovshdup_avx(auVar8);
  local_1a0 = auVar5._0_8_;
  uStack_198 = local_1a0;
  uStack_190 = local_1a0;
  uStack_188 = local_1a0;
  auVar5 = vshufps_avx(auVar8,auVar8,0xaa);
  local_1c0 = auVar5._0_8_;
  uStack_1b8 = local_1c0;
  uStack_1b0 = local_1c0;
  uStack_1a8 = local_1c0;
  auVar5 = vshufps_avx(auVar8,auVar8,0xff);
  local_1e0 = auVar5._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar5 = vmovshdup_avx(auVar10);
  local_440 = auVar5._0_8_;
  uStack_438 = local_440;
  uStack_430 = local_440;
  uStack_428 = local_440;
  auVar5 = vshufps_avx(auVar10,auVar10,0xaa);
  local_460 = auVar5._0_8_;
  uStack_458 = local_460;
  uStack_450 = local_460;
  uStack_448 = local_460;
  auVar5 = vshufps_avx(auVar10,auVar10,0xff);
  local_480 = auVar5._0_8_;
  uStack_478 = local_480;
  uStack_470 = local_480;
  uStack_468 = local_480;
  auVar5 = vmovshdup_avx(auVar9);
  local_4a0 = auVar5._0_8_;
  uStack_498 = local_4a0;
  uStack_490 = local_4a0;
  uStack_488 = local_4a0;
  auVar5 = vshufps_avx(auVar9,auVar9,0xaa);
  local_4c0 = auVar5._0_8_;
  uStack_4b8 = local_4c0;
  uStack_4b0 = local_4c0;
  uStack_4a8 = local_4c0;
  auVar5 = vshufps_avx(auVar9,auVar9,0xff);
  local_4e0 = auVar5._0_8_;
  uStack_4d8 = local_4e0;
  uStack_4d0 = local_4e0;
  uStack_4c8 = local_4e0;
  auVar5 = vmovshdup_avx(auVar7);
  local_500 = auVar5._0_8_;
  uStack_4f8 = local_500;
  uStack_4f0 = local_500;
  uStack_4e8 = local_500;
  auVar5 = vshufps_avx(auVar7,auVar7,0xaa);
  local_520 = auVar5._0_8_;
  uStack_518 = local_520;
  uStack_510 = local_520;
  uStack_508 = local_520;
  auVar5 = vshufps_avx(auVar7,auVar7,0xff);
  local_540 = auVar5._0_8_;
  uStack_538 = local_540;
  uStack_530 = local_540;
  uStack_528 = local_540;
  auVar5 = vfmadd231ps_fma(ZEXT432((uint)(fVar133 * fVar133)),_local_8e0,_local_8e0);
  auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar280,auVar280);
  uVar102 = auVar5._0_4_;
  local_200._4_4_ = uVar102;
  local_200._0_4_ = uVar102;
  local_200._8_4_ = uVar102;
  local_200._12_4_ = uVar102;
  local_200._16_4_ = uVar102;
  local_200._20_4_ = uVar102;
  local_200._24_4_ = uVar102;
  local_200._28_4_ = uVar102;
  fVar133 = *(float *)(ray + k * 4 + 0x60);
  local_990 = ZEXT416((uint)fVar134);
  local_260 = fVar133 - fVar134;
  fStack_25c = local_260;
  fStack_258 = local_260;
  fStack_254 = local_260;
  fStack_250 = local_260;
  fStack_24c = local_260;
  fStack_248 = local_260;
  fStack_244 = local_260;
  local_5e0 = uVar96;
  uStack_5dc = uVar96;
  uStack_5d8 = uVar96;
  uStack_5d4 = uVar96;
  uStack_5d0 = uVar96;
  uStack_5cc = uVar96;
  uStack_5c8 = uVar96;
  uStack_5c4 = uVar96;
  uStack_5fc = local_600;
  uStack_5f8 = local_600;
  uStack_5f4 = local_600;
  uStack_5f0 = local_600;
  uStack_5ec = local_600;
  uStack_5e8 = local_600;
  uStack_5e4 = local_600;
  uVar103 = 1;
  uVar104 = 0;
  local_560 = auVar8._0_4_;
  uStack_55c = local_560;
  uStack_558 = local_560;
  uStack_554 = local_560;
  uStack_550 = local_560;
  uStack_54c = local_560;
  uStack_548 = local_560;
  uStack_544 = local_560;
  local_580 = auVar10._0_4_;
  uStack_57c = local_580;
  uStack_578 = local_580;
  uStack_574 = local_580;
  uStack_570 = local_580;
  uStack_56c = local_580;
  uStack_568 = local_580;
  uStack_564 = local_580;
  local_5a0 = auVar9._0_4_;
  uStack_59c = local_5a0;
  uStack_598 = local_5a0;
  uStack_594 = local_5a0;
  uStack_590 = local_5a0;
  uStack_58c = local_5a0;
  uStack_588 = local_5a0;
  uStack_584 = local_5a0;
  fVar191 = auVar7._0_4_;
  auVar229._4_4_ = uStack_8fc;
  auVar229._0_4_ = local_900;
  auVar229._8_4_ = uStack_8f8;
  auVar229._12_4_ = uStack_8f4;
  auVar229._16_4_ = uStack_8f0;
  auVar229._20_4_ = uStack_8ec;
  auVar229._24_4_ = uStack_8e8;
  auVar229._28_4_ = uStack_8e4;
  local_5c0 = vandps_avx(local_200,auVar229);
  auVar5 = vsqrtss_avx(local_a00,local_a00);
  auVar6 = vsqrtss_avx(local_a00,local_a00);
  local_980 = ZEXT816(0x3f80000000000000);
  local_240 = fVar191;
  fStack_23c = fVar191;
  fStack_238 = fVar191;
  fStack_234 = fVar191;
  fStack_230 = fVar191;
  fStack_22c = fVar191;
  fStack_228 = fVar191;
  fStack_224 = fVar191;
  uVar99 = 0;
  fVar273 = 0.0;
  do {
    auVar110 = vmovshdup_avx(local_980);
    fVar250 = local_980._0_4_;
    fVar241 = auVar110._0_4_ - fVar250;
    fVar106 = fVar241 * 0.04761905;
    local_a60._4_4_ = fVar250;
    local_a60._0_4_ = fVar250;
    local_a60._8_4_ = fVar250;
    local_a60._12_4_ = fVar250;
    local_a60._16_4_ = fVar250;
    local_a60._20_4_ = fVar250;
    local_a60._24_4_ = fVar250;
    local_a60._28_4_ = fVar250;
    local_820._4_4_ = fVar241;
    local_820._0_4_ = fVar241;
    local_820._8_4_ = fVar241;
    local_820._12_4_ = fVar241;
    local_820._16_4_ = fVar241;
    local_820._20_4_ = fVar241;
    local_820._24_4_ = fVar241;
    local_820._28_4_ = fVar241;
    auVar110 = vfmadd231ps_fma(local_a60,local_820,_DAT_02020f20);
    auVar122._8_4_ = 0x3f800000;
    auVar122._0_8_ = &DAT_3f8000003f800000;
    auVar122._12_4_ = 0x3f800000;
    auVar122._16_4_ = 0x3f800000;
    auVar122._20_4_ = 0x3f800000;
    auVar122._24_4_ = 0x3f800000;
    auVar122._28_4_ = 0x3f800000;
    auVar217 = vsubps_avx(auVar122,ZEXT1632(auVar110));
    fVar220 = auVar110._0_4_;
    fVar221 = auVar110._4_4_;
    fVar239 = auVar110._8_4_;
    fVar240 = auVar110._12_4_;
    fVar241 = auVar217._0_4_;
    fVar250 = auVar217._4_4_;
    fVar251 = auVar217._8_4_;
    fVar252 = auVar217._12_4_;
    fVar253 = auVar217._16_4_;
    fVar254 = auVar217._20_4_;
    fVar256 = auVar217._24_4_;
    fVar257 = fVar220 * 3.0;
    fVar270 = fVar221 * 3.0;
    fVar271 = fVar239 * 3.0;
    fVar272 = fVar240 * 3.0;
    auVar189._0_4_ = fVar241 * fVar241;
    auVar189._4_4_ = fVar250 * fVar250;
    auVar189._8_4_ = fVar251 * fVar251;
    auVar189._12_4_ = fVar252 * fVar252;
    auVar189._16_4_ = fVar253 * fVar253;
    auVar189._20_4_ = fVar254 * fVar254;
    auVar189._28_36_ = auVar285._28_36_;
    auVar189._24_4_ = fVar256 * fVar256;
    fVar255 = auVar217._28_4_;
    auVar285._0_4_ = (auVar189._0_4_ * (fVar241 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar285._4_4_ = (auVar189._4_4_ * (fVar250 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar285._8_4_ = (auVar189._8_4_ * (fVar251 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar285._12_4_ = (auVar189._12_4_ * (fVar252 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar285._16_4_ = (auVar189._16_4_ * (fVar253 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar285._20_4_ = (auVar189._20_4_ * (fVar254 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar285._28_36_ = auVar306._28_36_;
    auVar285._24_4_ = (auVar189._24_4_ * (fVar256 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar217 = auVar285._0_32_;
    fVar222 = fVar220 * fVar220 * (float)((uint)fVar241 ^ local_7e0) * 0.5;
    fVar231 = fVar221 * fVar221 * (float)((uint)fVar250 ^ uStack_7dc) * 0.5;
    fVar232 = fVar239 * fVar239 * (float)((uint)fVar251 ^ uStack_7d8) * 0.5;
    fVar233 = fVar240 * fVar240 * (float)((uint)fVar252 ^ uStack_7d4) * 0.5;
    fVar234 = (float)((uint)fVar253 ^ (uint)fStack_7d0) * 0.0 * 0.0 * 0.5;
    fVar235 = (float)((uint)fVar254 ^ (uint)fStack_7cc) * 0.0 * 0.0 * 0.5;
    fVar236 = (float)((uint)fVar256 ^ (uint)fStack_7c8) * 0.0 * 0.0 * 0.5;
    auVar12._4_4_ = fStack_23c * fVar231;
    auVar12._0_4_ = local_240 * fVar222;
    auVar12._8_4_ = fStack_238 * fVar232;
    auVar12._12_4_ = fStack_234 * fVar233;
    auVar12._16_4_ = fStack_230 * fVar234;
    auVar12._20_4_ = fStack_22c * fVar235;
    auVar12._24_4_ = fStack_228 * fVar236;
    auVar12._28_4_ = (uint)fVar255 ^ uStack_7c4;
    auVar177._4_4_ = fVar231 * local_500._4_4_;
    auVar177._0_4_ = fVar222 * (float)local_500;
    auVar177._8_4_ = fVar232 * (float)uStack_4f8;
    auVar177._12_4_ = fVar233 * uStack_4f8._4_4_;
    auVar177._16_4_ = fVar234 * (float)uStack_4f0;
    auVar177._20_4_ = fVar235 * uStack_4f0._4_4_;
    auVar177._24_4_ = fVar236 * (float)uStack_4e8;
    auVar177._28_4_ = uStack_7c4;
    auVar13._4_4_ = fVar231 * local_520._4_4_;
    auVar13._0_4_ = fVar222 * (float)local_520;
    auVar13._8_4_ = fVar232 * (float)uStack_518;
    auVar13._12_4_ = fVar233 * uStack_518._4_4_;
    auVar13._16_4_ = fVar234 * (float)uStack_510;
    auVar13._20_4_ = fVar235 * uStack_510._4_4_;
    auVar13._24_4_ = fVar236 * (float)uStack_508;
    auVar13._28_4_ = 0x40000000;
    auVar153._4_4_ = fVar231 * local_540._4_4_;
    auVar153._0_4_ = fVar222 * (float)local_540;
    auVar153._8_4_ = fVar232 * (float)uStack_538;
    auVar153._12_4_ = fVar233 * uStack_538._4_4_;
    auVar153._16_4_ = fVar234 * (float)uStack_530;
    auVar153._20_4_ = fVar235 * uStack_530._4_4_;
    auVar153._24_4_ = fVar236 * (float)uStack_528;
    auVar153._28_4_ = fVar273;
    auVar316._4_4_ = uStack_59c;
    auVar316._0_4_ = local_5a0;
    auVar316._8_4_ = uStack_598;
    auVar316._12_4_ = uStack_594;
    auVar316._16_4_ = uStack_590;
    auVar316._20_4_ = uStack_58c;
    auVar316._24_4_ = uStack_588;
    auVar316._28_4_ = uStack_584;
    auVar110 = vfmadd231ps_fma(auVar12,auVar217,auVar316);
    auVar82._8_8_ = uStack_498;
    auVar82._0_8_ = local_4a0;
    auVar82._16_8_ = uStack_490;
    auVar82._24_8_ = uStack_488;
    auVar109 = vfmadd231ps_fma(auVar177,auVar217,auVar82);
    auVar80._8_8_ = uStack_4b8;
    auVar80._0_8_ = local_4c0;
    auVar80._16_8_ = uStack_4b0;
    auVar80._24_8_ = uStack_4a8;
    auVar168 = vfmadd231ps_fma(auVar13,auVar217,auVar80);
    auVar78._8_8_ = uStack_4d8;
    auVar78._0_8_ = local_4e0;
    auVar78._16_8_ = uStack_4d0;
    auVar78._24_8_ = uStack_4c8;
    auVar136 = vfmadd231ps_fma(auVar153,auVar217,auVar78);
    auVar125._4_4_ = fVar250 * fVar250 * (float)((uint)fVar221 ^ uStack_7dc) * 0.5;
    auVar125._0_4_ = fVar241 * fVar241 * (float)((uint)fVar220 ^ local_7e0) * 0.5;
    auVar125._8_4_ = fVar251 * fVar251 * (float)((uint)fVar239 ^ uStack_7d8) * 0.5;
    auVar125._12_4_ = fVar252 * fVar252 * (float)((uint)fVar240 ^ uStack_7d4) * 0.5;
    auVar125._16_4_ = fVar253 * fVar253 * fStack_7d0 * 0.5;
    auVar125._20_4_ = fVar254 * fVar254 * fStack_7cc * 0.5;
    auVar125._24_4_ = fVar256 * fVar256 * fStack_7c8 * 0.5;
    auVar125._28_4_ = auVar300._28_4_;
    auVar247._4_4_ = ((fVar270 + -5.0) * fVar221 * fVar221 + 2.0) * 0.5;
    auVar247._0_4_ = ((fVar257 + -5.0) * fVar220 * fVar220 + 2.0) * 0.5;
    auVar247._8_4_ = ((fVar271 + -5.0) * fVar239 * fVar239 + 2.0) * 0.5;
    auVar247._12_4_ = ((fVar272 + -5.0) * fVar240 * fVar240 + 2.0) * 0.5;
    auVar247._16_4_ = 0x3f800000;
    auVar247._20_4_ = 0x3f800000;
    auVar247._24_4_ = 0x3f800000;
    auVar247._28_4_ = auVar306._28_4_ + 2.0;
    auVar74._4_4_ = uStack_57c;
    auVar74._0_4_ = local_580;
    auVar74._8_4_ = uStack_578;
    auVar74._12_4_ = uStack_574;
    auVar74._16_4_ = uStack_570;
    auVar74._20_4_ = uStack_56c;
    auVar74._24_4_ = uStack_568;
    auVar74._28_4_ = uStack_564;
    auVar110 = vfmadd231ps_fma(ZEXT1632(auVar110),auVar247,auVar74);
    auVar88._8_8_ = uStack_438;
    auVar88._0_8_ = local_440;
    auVar88._16_8_ = uStack_430;
    auVar88._24_8_ = uStack_428;
    auVar109 = vfmadd231ps_fma(ZEXT1632(auVar109),auVar247,auVar88);
    auVar86._8_8_ = uStack_458;
    auVar86._0_8_ = local_460;
    auVar86._16_8_ = uStack_450;
    auVar86._24_8_ = uStack_448;
    auVar168 = vfmadd231ps_fma(ZEXT1632(auVar168),auVar247,auVar86);
    auVar84._8_8_ = uStack_478;
    auVar84._0_8_ = local_480;
    auVar84._16_8_ = uStack_470;
    auVar84._24_8_ = uStack_468;
    auVar136 = vfmadd231ps_fma(ZEXT1632(auVar136),auVar247,auVar84);
    auVar76._4_4_ = uStack_55c;
    auVar76._0_4_ = local_560;
    auVar76._8_4_ = uStack_558;
    auVar76._12_4_ = uStack_554;
    auVar76._16_4_ = uStack_550;
    auVar76._20_4_ = uStack_54c;
    auVar76._24_4_ = uStack_548;
    auVar76._28_4_ = uStack_544;
    auVar110 = vfmadd231ps_fma(ZEXT1632(auVar110),auVar125,auVar76);
    auVar93._8_8_ = uStack_198;
    auVar93._0_8_ = local_1a0;
    auVar93._16_8_ = uStack_190;
    auVar93._24_8_ = uStack_188;
    auVar109 = vfmadd231ps_fma(ZEXT1632(auVar109),auVar125,auVar93);
    auVar177 = ZEXT1632(auVar109);
    auVar92._8_8_ = uStack_1b8;
    auVar92._0_8_ = local_1c0;
    auVar92._16_8_ = uStack_1b0;
    auVar92._24_8_ = uStack_1a8;
    auVar109 = vfmadd231ps_fma(ZEXT1632(auVar168),auVar125,auVar92);
    auVar91._8_8_ = uStack_1d8;
    auVar91._0_8_ = local_1e0;
    auVar91._16_8_ = uStack_1d0;
    auVar91._24_8_ = uStack_1c8;
    auVar168 = vfmadd231ps_fma(ZEXT1632(auVar136),auVar91,auVar125);
    auVar14._4_4_ = (fVar250 + fVar250) * fVar221;
    auVar14._0_4_ = (fVar241 + fVar241) * fVar220;
    auVar14._8_4_ = (fVar251 + fVar251) * fVar239;
    auVar14._12_4_ = (fVar252 + fVar252) * fVar240;
    auVar14._16_4_ = (fVar253 + fVar253) * 0.0;
    auVar14._20_4_ = (fVar254 + fVar254) * 0.0;
    auVar14._24_4_ = (fVar256 + fVar256) * 0.0;
    auVar14._28_4_ = 0;
    auVar217 = vsubps_avx(auVar14,auVar189._0_32_);
    fVar273 = auVar269._28_4_ + 2.0;
    auVar15._4_4_ = (fVar250 + fVar250) * (fVar270 + 2.0);
    auVar15._0_4_ = (fVar241 + fVar241) * (fVar257 + 2.0);
    auVar15._8_4_ = (fVar251 + fVar251) * (fVar271 + 2.0);
    auVar15._12_4_ = (fVar252 + fVar252) * (fVar272 + 2.0);
    auVar15._16_4_ = (fVar253 + fVar253) * 2.0;
    auVar15._20_4_ = (fVar254 + fVar254) * 2.0;
    auVar15._24_4_ = (fVar256 + fVar256) * 2.0;
    auVar15._28_4_ = fVar273;
    auVar16._4_4_ = fVar250 * fVar250 * 3.0;
    auVar16._0_4_ = fVar241 * fVar241 * 3.0;
    auVar16._8_4_ = fVar251 * fVar251 * 3.0;
    auVar16._12_4_ = fVar252 * fVar252 * 3.0;
    auVar16._16_4_ = fVar253 * fVar253 * 3.0;
    auVar16._20_4_ = fVar254 * fVar254 * 3.0;
    auVar16._24_4_ = fVar256 * fVar256 * 3.0;
    auVar16._28_4_ = fVar255;
    auVar229 = vsubps_avx(auVar15,auVar16);
    auVar121 = vsubps_avx(ZEXT1632(CONCAT412(fVar240 * fVar240,
                                             CONCAT48(fVar239 * fVar239,
                                                      CONCAT44(fVar221 * fVar221,fVar220 * fVar220))
                                            )),auVar14);
    auVar248._4_4_ = auVar217._4_4_ * 0.5;
    auVar248._0_4_ = auVar217._0_4_ * 0.5;
    auVar248._8_4_ = auVar217._8_4_ * 0.5;
    auVar248._12_4_ = auVar217._12_4_ * 0.5;
    auVar248._16_4_ = auVar217._16_4_ * 0.5;
    auVar248._20_4_ = auVar217._20_4_ * 0.5;
    auVar248._24_4_ = auVar217._24_4_ * 0.5;
    auVar248._28_4_ = fVar273;
    auVar18._28_4_ = auVar269._28_4_ + -5.0 + 0.0;
    auVar18._0_28_ =
         ZEXT1628(CONCAT412(((fVar240 + fVar240) * (fVar272 + -5.0) + fVar272 * fVar240) * 0.5,
                            CONCAT48(((fVar239 + fVar239) * (fVar271 + -5.0) + fVar271 * fVar239) *
                                     0.5,CONCAT44(((fVar221 + fVar221) * (fVar270 + -5.0) +
                                                  fVar270 * fVar221) * 0.5,
                                                  ((fVar220 + fVar220) * (fVar257 + -5.0) +
                                                  fVar257 * fVar220) * 0.5))));
    auVar19._4_4_ = auVar229._4_4_ * 0.5;
    auVar19._0_4_ = auVar229._0_4_ * 0.5;
    auVar19._8_4_ = auVar229._8_4_ * 0.5;
    auVar19._12_4_ = auVar229._12_4_ * 0.5;
    auVar19._16_4_ = auVar229._16_4_ * 0.5;
    auVar19._20_4_ = auVar229._20_4_ * 0.5;
    fVar273 = auVar229._28_4_;
    auVar19._24_4_ = auVar229._24_4_ * 0.5;
    auVar19._28_4_ = fVar273;
    fVar241 = auVar121._0_4_ * 0.5;
    fVar250 = auVar121._4_4_ * 0.5;
    fVar251 = auVar121._8_4_ * 0.5;
    fVar252 = auVar121._12_4_ * 0.5;
    fVar253 = auVar121._16_4_ * 0.5;
    fVar254 = auVar121._20_4_ * 0.5;
    fVar256 = auVar121._24_4_ * 0.5;
    auVar20._4_4_ = fStack_23c * fVar250;
    auVar20._0_4_ = local_240 * fVar241;
    auVar20._8_4_ = fStack_238 * fVar251;
    auVar20._12_4_ = fStack_234 * fVar252;
    auVar20._16_4_ = fStack_230 * fVar253;
    auVar20._20_4_ = fStack_22c * fVar254;
    auVar20._24_4_ = fStack_228 * fVar256;
    auVar20._28_4_ = fStack_224;
    auVar148._4_4_ = fVar250 * local_500._4_4_;
    auVar148._0_4_ = fVar241 * (float)local_500;
    auVar148._8_4_ = fVar251 * (float)uStack_4f8;
    auVar148._12_4_ = fVar252 * uStack_4f8._4_4_;
    auVar148._16_4_ = fVar253 * (float)uStack_4f0;
    auVar148._20_4_ = fVar254 * uStack_4f0._4_4_;
    auVar148._24_4_ = fVar256 * (float)uStack_4e8;
    auVar148._28_4_ = 0x40000000;
    auVar277._4_4_ = fVar250 * local_520._4_4_;
    auVar277._0_4_ = fVar241 * (float)local_520;
    auVar277._8_4_ = fVar251 * (float)uStack_518;
    auVar277._12_4_ = fVar252 * uStack_518._4_4_;
    auVar277._16_4_ = fVar253 * (float)uStack_510;
    auVar277._20_4_ = fVar254 * uStack_510._4_4_;
    auVar277._24_4_ = fVar256 * (float)uStack_508;
    auVar277._28_4_ = auVar217._28_4_;
    auVar281._4_4_ = fVar250 * local_540._4_4_;
    auVar281._0_4_ = fVar241 * (float)local_540;
    auVar281._8_4_ = fVar251 * (float)uStack_538;
    auVar281._12_4_ = fVar252 * uStack_538._4_4_;
    auVar281._16_4_ = fVar253 * (float)uStack_530;
    auVar281._20_4_ = fVar254 * uStack_530._4_4_;
    auVar281._24_4_ = fVar256 * (float)uStack_528;
    auVar281._28_4_ = auVar121._28_4_;
    auVar73._4_4_ = uStack_59c;
    auVar73._0_4_ = local_5a0;
    auVar73._8_4_ = uStack_598;
    auVar73._12_4_ = uStack_594;
    auVar73._16_4_ = uStack_590;
    auVar73._20_4_ = uStack_58c;
    auVar73._24_4_ = uStack_588;
    auVar73._28_4_ = uStack_584;
    auVar136 = vfmadd231ps_fma(auVar20,auVar19,auVar73);
    auVar83._8_8_ = uStack_498;
    auVar83._0_8_ = local_4a0;
    auVar83._16_8_ = uStack_490;
    auVar83._24_8_ = uStack_488;
    auVar108 = vfmadd231ps_fma(auVar148,auVar19,auVar83);
    auVar81._8_8_ = uStack_4b8;
    auVar81._0_8_ = local_4c0;
    auVar81._16_8_ = uStack_4b0;
    auVar81._24_8_ = uStack_4a8;
    auVar116 = vfmadd231ps_fma(auVar277,auVar19,auVar81);
    auVar79._8_8_ = uStack_4d8;
    auVar79._0_8_ = local_4e0;
    auVar79._16_8_ = uStack_4d0;
    auVar79._24_8_ = uStack_4c8;
    auVar145 = vfmadd231ps_fma(auVar281,auVar19,auVar79);
    auVar75._4_4_ = uStack_57c;
    auVar75._0_4_ = local_580;
    auVar75._8_4_ = uStack_578;
    auVar75._12_4_ = uStack_574;
    auVar75._16_4_ = uStack_570;
    auVar75._20_4_ = uStack_56c;
    auVar75._24_4_ = uStack_568;
    auVar75._28_4_ = uStack_564;
    auVar136 = vfmadd231ps_fma(ZEXT1632(auVar136),auVar18,auVar75);
    auVar89._8_8_ = uStack_438;
    auVar89._0_8_ = local_440;
    auVar89._16_8_ = uStack_430;
    auVar89._24_8_ = uStack_428;
    auVar108 = vfmadd231ps_fma(ZEXT1632(auVar108),auVar18,auVar89);
    auVar87._8_8_ = uStack_458;
    auVar87._0_8_ = local_460;
    auVar87._16_8_ = uStack_450;
    auVar87._24_8_ = uStack_448;
    auVar116 = vfmadd231ps_fma(ZEXT1632(auVar116),auVar18,auVar87);
    auVar85._8_8_ = uStack_478;
    auVar85._0_8_ = local_480;
    auVar85._16_8_ = uStack_470;
    auVar85._24_8_ = uStack_468;
    auVar145 = vfmadd231ps_fma(ZEXT1632(auVar145),auVar18,auVar85);
    auVar77._4_4_ = uStack_55c;
    auVar77._0_4_ = local_560;
    auVar77._8_4_ = uStack_558;
    auVar77._12_4_ = uStack_554;
    auVar77._16_4_ = uStack_550;
    auVar77._20_4_ = uStack_54c;
    auVar77._24_4_ = uStack_548;
    auVar77._28_4_ = uStack_544;
    auVar136 = vfmadd231ps_fma(ZEXT1632(auVar136),auVar248,auVar77);
    auVar108 = vfmadd231ps_fma(ZEXT1632(auVar108),auVar248,auVar93);
    auVar116 = vfmadd231ps_fma(ZEXT1632(auVar116),auVar248,auVar92);
    auVar145 = vfmadd231ps_fma(ZEXT1632(auVar145),auVar91,auVar248);
    local_7c0._0_4_ = auVar136._0_4_ * fVar106;
    local_7c0._4_4_ = auVar136._4_4_ * fVar106;
    local_7c0._8_4_ = auVar136._8_4_ * fVar106;
    local_7c0._12_4_ = auVar136._12_4_ * fVar106;
    local_7c0._16_4_ = fVar106 * 0.0;
    local_7c0._20_4_ = fVar106 * 0.0;
    local_7c0._24_4_ = fVar106 * 0.0;
    local_7c0._28_4_ = 0;
    fVar241 = auVar108._0_4_ * fVar106;
    fVar250 = auVar108._4_4_ * fVar106;
    auVar21._4_4_ = fVar250;
    auVar21._0_4_ = fVar241;
    fVar253 = auVar108._8_4_ * fVar106;
    auVar21._8_4_ = fVar253;
    fVar222 = auVar108._12_4_ * fVar106;
    auVar21._12_4_ = fVar222;
    auVar21._16_4_ = fVar106 * 0.0;
    auVar21._20_4_ = fVar106 * 0.0;
    auVar21._24_4_ = fVar106 * 0.0;
    auVar21._28_4_ = fVar255 + fVar255;
    fVar318 = auVar116._0_4_ * fVar106;
    fVar319 = auVar116._4_4_ * fVar106;
    auVar294._4_4_ = fVar319;
    auVar294._0_4_ = fVar318;
    fVar320 = auVar116._8_4_ * fVar106;
    auVar294._8_4_ = fVar320;
    fVar321 = auVar116._12_4_ * fVar106;
    auVar294._12_4_ = fVar321;
    fVar322 = fVar106 * 0.0;
    auVar294._16_4_ = fVar322;
    fVar323 = fVar106 * 0.0;
    auVar294._20_4_ = fVar323;
    fVar324 = fVar106 * 0.0;
    auVar294._24_4_ = fVar324;
    auVar294._28_4_ = 0x3f000000;
    fVar251 = fVar106 * auVar145._0_4_;
    fVar252 = fVar106 * auVar145._4_4_;
    auVar22._4_4_ = fVar252;
    auVar22._0_4_ = fVar251;
    fVar254 = fVar106 * auVar145._8_4_;
    auVar22._8_4_ = fVar254;
    fVar256 = fVar106 * auVar145._12_4_;
    auVar22._12_4_ = fVar256;
    auVar22._16_4_ = fVar106 * 0.0;
    auVar22._20_4_ = fVar106 * 0.0;
    auVar22._24_4_ = fVar106 * 0.0;
    auVar22._28_4_ = fVar273;
    auVar148 = ZEXT1632(auVar110);
    local_a20 = vpermps_avx2(_DAT_0205d4a0,auVar148);
    _local_9e0 = vpermps_avx2(_DAT_0205d4a0,auVar177);
    auVar248 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar109));
    auVar12 = vsubps_avx(local_a20,ZEXT1632(auVar110));
    auVar13 = vsubps_avx(auVar248,ZEXT1632(auVar109));
    auVar316 = ZEXT1632(auVar109);
    fVar231 = auVar13._0_4_;
    fVar235 = auVar13._4_4_;
    auVar23._4_4_ = fVar235 * local_7c0._4_4_;
    auVar23._0_4_ = fVar231 * local_7c0._0_4_;
    fVar236 = auVar13._8_4_;
    auVar23._8_4_ = fVar236 * local_7c0._8_4_;
    fVar220 = auVar13._12_4_;
    auVar23._12_4_ = fVar220 * local_7c0._12_4_;
    fVar221 = auVar13._16_4_;
    auVar23._16_4_ = fVar221 * local_7c0._16_4_;
    fVar239 = auVar13._20_4_;
    auVar23._20_4_ = fVar239 * local_7c0._20_4_;
    fVar240 = auVar13._24_4_;
    auVar23._24_4_ = fVar240 * local_7c0._24_4_;
    auVar23._28_4_ = auVar248._28_4_;
    auVar110 = vfmsub231ps_fma(auVar23,auVar294,auVar12);
    auVar153 = vsubps_avx(_local_9e0,auVar177);
    fVar301 = auVar12._0_4_;
    fVar307 = auVar12._4_4_;
    auVar24._4_4_ = fVar307 * fVar250;
    auVar24._0_4_ = fVar301 * fVar241;
    fVar308 = auVar12._8_4_;
    auVar24._8_4_ = fVar308 * fVar253;
    fVar309 = auVar12._12_4_;
    auVar24._12_4_ = fVar309 * fVar222;
    fVar310 = auVar12._16_4_;
    auVar24._16_4_ = fVar310 * fVar106 * 0.0;
    fVar311 = auVar12._20_4_;
    auVar24._20_4_ = fVar311 * fVar106 * 0.0;
    fVar312 = auVar12._24_4_;
    auVar24._24_4_ = fVar312 * fVar106 * 0.0;
    auVar24._28_4_ = local_a20._28_4_;
    auVar109 = vfmsub231ps_fma(auVar24,local_7c0,auVar153);
    auVar110 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar109._12_4_ * auVar109._12_4_,
                                                  CONCAT48(auVar109._8_4_ * auVar109._8_4_,
                                                           CONCAT44(auVar109._4_4_ * auVar109._4_4_,
                                                                    auVar109._0_4_ * auVar109._0_4_)
                                                          ))),ZEXT1632(auVar110),ZEXT1632(auVar110))
    ;
    fVar257 = auVar153._0_4_;
    fVar270 = auVar153._4_4_;
    auVar25._4_4_ = fVar270 * fVar319;
    auVar25._0_4_ = fVar257 * fVar318;
    fVar271 = auVar153._8_4_;
    auVar25._8_4_ = fVar271 * fVar320;
    fVar272 = auVar153._12_4_;
    auVar25._12_4_ = fVar272 * fVar321;
    fVar286 = auVar153._16_4_;
    auVar25._16_4_ = fVar286 * fVar322;
    fVar287 = auVar153._20_4_;
    auVar25._20_4_ = fVar287 * fVar323;
    fVar288 = auVar153._24_4_;
    auVar25._24_4_ = fVar288 * fVar324;
    auVar25._28_4_ = local_9e0._28_4_;
    auVar136 = vfmsub231ps_fma(auVar25,auVar21,auVar13);
    auVar238._0_4_ = fVar231 * fVar231;
    auVar238._4_4_ = fVar235 * fVar235;
    auVar238._8_4_ = fVar236 * fVar236;
    auVar238._12_4_ = fVar220 * fVar220;
    auVar238._16_4_ = fVar221 * fVar221;
    auVar238._20_4_ = fVar239 * fVar239;
    auVar238._24_4_ = fVar240 * fVar240;
    auVar238._28_4_ = 0;
    auVar109 = vfmadd231ps_fma(auVar238,auVar153,auVar153);
    auVar109 = vfmadd231ps_fma(ZEXT1632(auVar109),auVar12,auVar12);
    auVar217 = vrcpps_avx(ZEXT1632(auVar109));
    auVar136 = vfmadd231ps_fma(ZEXT1632(auVar110),ZEXT1632(auVar136),ZEXT1632(auVar136));
    auVar123._8_4_ = 0x3f800000;
    auVar123._0_8_ = &DAT_3f8000003f800000;
    auVar123._12_4_ = 0x3f800000;
    auVar123._16_4_ = 0x3f800000;
    auVar123._20_4_ = 0x3f800000;
    auVar123._24_4_ = 0x3f800000;
    auVar123._28_4_ = 0x3f800000;
    auVar110 = vfnmadd213ps_fma(auVar217,ZEXT1632(auVar109),auVar123);
    auVar110 = vfmadd132ps_fma(ZEXT1632(auVar110),auVar217,auVar217);
    auVar18 = vpermps_avx2(_DAT_0205d4a0,local_7c0);
    local_800 = vpermps_avx2(_DAT_0205d4a0,auVar294);
    auVar94._4_4_ = fVar235 * auVar18._4_4_;
    auVar94._0_4_ = fVar231 * auVar18._0_4_;
    auVar94._8_4_ = fVar236 * auVar18._8_4_;
    auVar94._12_4_ = fVar220 * auVar18._12_4_;
    auVar94._16_4_ = fVar221 * auVar18._16_4_;
    auVar94._20_4_ = fVar239 * auVar18._20_4_;
    auVar94._24_4_ = fVar240 * auVar18._24_4_;
    auVar94._28_4_ = DAT_0205d4a0._28_4_;
    auVar108 = vfmsub231ps_fma(auVar94,local_800,auVar12);
    auVar19 = vpermps_avx2(_DAT_0205d4a0,auVar21);
    auVar26._4_4_ = fVar307 * auVar19._4_4_;
    auVar26._0_4_ = fVar301 * auVar19._0_4_;
    auVar26._8_4_ = fVar308 * auVar19._8_4_;
    auVar26._12_4_ = fVar309 * auVar19._12_4_;
    auVar26._16_4_ = fVar310 * auVar19._16_4_;
    auVar26._20_4_ = fVar311 * auVar19._20_4_;
    auVar26._24_4_ = fVar312 * auVar19._24_4_;
    auVar26._28_4_ = 0;
    auVar116 = vfmsub231ps_fma(auVar26,auVar18,auVar153);
    auVar108 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar116._12_4_ * auVar116._12_4_,
                                                  CONCAT48(auVar116._8_4_ * auVar116._8_4_,
                                                           CONCAT44(auVar116._4_4_ * auVar116._4_4_,
                                                                    auVar116._0_4_ * auVar116._0_4_)
                                                          ))),ZEXT1632(auVar108),ZEXT1632(auVar108))
    ;
    fVar241 = local_800._0_4_;
    auVar262._0_4_ = fVar257 * fVar241;
    fVar250 = local_800._4_4_;
    auVar262._4_4_ = fVar270 * fVar250;
    fVar253 = local_800._8_4_;
    auVar262._8_4_ = fVar271 * fVar253;
    fVar255 = local_800._12_4_;
    auVar262._12_4_ = fVar272 * fVar255;
    fVar232 = local_800._16_4_;
    auVar262._16_4_ = fVar286 * fVar232;
    fVar233 = local_800._20_4_;
    auVar262._20_4_ = fVar287 * fVar233;
    fVar234 = local_800._24_4_;
    auVar262._24_4_ = fVar288 * fVar234;
    auVar262._28_4_ = 0;
    auVar116 = vfmsub231ps_fma(auVar262,auVar19,auVar13);
    auVar108 = vfmadd231ps_fma(ZEXT1632(auVar108),ZEXT1632(auVar116),ZEXT1632(auVar116));
    auVar217 = vmaxps_avx(ZEXT1632(CONCAT412(auVar136._12_4_ * auVar110._12_4_,
                                             CONCAT48(auVar136._8_4_ * auVar110._8_4_,
                                                      CONCAT44(auVar136._4_4_ * auVar110._4_4_,
                                                               auVar136._0_4_ * auVar110._0_4_)))),
                          ZEXT1632(CONCAT412(auVar108._12_4_ * auVar110._12_4_,
                                             CONCAT48(auVar108._8_4_ * auVar110._8_4_,
                                                      CONCAT44(auVar108._4_4_ * auVar110._4_4_,
                                                               auVar108._0_4_ * auVar110._0_4_)))));
    auVar263._0_4_ = auVar168._0_4_ + fVar251;
    auVar263._4_4_ = auVar168._4_4_ + fVar252;
    auVar263._8_4_ = auVar168._8_4_ + fVar254;
    auVar263._12_4_ = auVar168._12_4_ + fVar256;
    auVar263._16_4_ = fVar106 * 0.0 + 0.0;
    auVar263._20_4_ = fVar106 * 0.0 + 0.0;
    auVar263._24_4_ = fVar106 * 0.0 + 0.0;
    auVar263._28_4_ = fVar273 + 0.0;
    auStack_850 = auVar263._16_16_;
    local_840 = ZEXT1632(auVar168);
    auVar229 = vsubps_avx(local_840,auVar22);
    local_880 = vpermps_avx2(_DAT_0205d4a0,auVar229);
    auVar20 = vpermps_avx2(_DAT_0205d4a0,local_840);
    auVar229 = vmaxps_avx(local_840,auVar263);
    auVar121 = vmaxps_avx(local_880,auVar20);
    auVar11 = vrsqrtps_avx(ZEXT1632(auVar109));
    auVar121 = vmaxps_avx(auVar229,auVar121);
    uVar102 = auVar229._28_4_;
    fVar273 = auVar11._0_4_;
    fVar106 = auVar11._4_4_;
    fVar251 = auVar11._8_4_;
    fVar252 = auVar11._12_4_;
    fVar254 = auVar11._16_4_;
    fVar256 = auVar11._20_4_;
    fVar222 = auVar11._24_4_;
    auVar275._0_4_ = fVar273 * fVar273 * fVar273 * auVar109._0_4_ * -0.5;
    auVar275._4_4_ = fVar106 * fVar106 * fVar106 * auVar109._4_4_ * -0.5;
    auVar275._8_4_ = fVar251 * fVar251 * fVar251 * auVar109._8_4_ * -0.5;
    auVar275._12_4_ = fVar252 * fVar252 * fVar252 * auVar109._12_4_ * -0.5;
    auVar275._16_4_ = fVar254 * fVar254 * fVar254 * -0.0;
    auVar275._20_4_ = fVar256 * fVar256 * fVar256 * -0.0;
    auVar275._24_4_ = fVar222 * fVar222 * fVar222 * -0.0;
    auVar275._28_4_ = 0;
    auVar124._8_4_ = 0x3fc00000;
    auVar124._0_8_ = 0x3fc000003fc00000;
    auVar124._12_4_ = 0x3fc00000;
    auVar124._16_4_ = 0x3fc00000;
    auVar124._20_4_ = 0x3fc00000;
    auVar124._24_4_ = 0x3fc00000;
    auVar124._28_4_ = 0x3fc00000;
    auVar110 = vfmadd231ps_fma(auVar275,auVar124,auVar11);
    fVar106 = auVar110._0_4_;
    fVar251 = auVar110._4_4_;
    auVar27._4_4_ = fVar270 * fVar251;
    auVar27._0_4_ = fVar257 * fVar106;
    fVar254 = auVar110._8_4_;
    auVar27._8_4_ = fVar271 * fVar254;
    fVar222 = auVar110._12_4_;
    auVar27._12_4_ = fVar272 * fVar222;
    auVar27._16_4_ = fVar286 * 0.0;
    auVar27._20_4_ = fVar287 * 0.0;
    auVar27._24_4_ = fVar288 * 0.0;
    auVar27._28_4_ = uVar102;
    auVar28._4_4_ = (float)local_a40._4_4_ * fVar235 * fVar251;
    auVar28._0_4_ = (float)local_a40._0_4_ * fVar231 * fVar106;
    auVar28._8_4_ = fStack_a38 * fVar236 * fVar254;
    auVar28._12_4_ = fStack_a34 * fVar220 * fVar222;
    auVar28._16_4_ = fStack_a30 * fVar221 * 0.0;
    auVar28._20_4_ = fStack_a2c * fVar239 * 0.0;
    auVar28._24_4_ = fStack_a28 * fVar240 * 0.0;
    auVar28._28_4_ = auVar13._28_4_;
    auVar110 = vfmadd231ps_fma(auVar28,auVar27,_local_8e0);
    auVar300 = ZEXT864(0) << 0x20;
    auVar229 = vsubps_avx(ZEXT832(0) << 0x20,auVar316);
    auVar285 = ZEXT3264(auVar229);
    fVar271 = auVar229._0_4_;
    auVar276._0_4_ = fVar271 * fVar231 * fVar106;
    fVar272 = auVar229._4_4_;
    auVar276._4_4_ = fVar272 * fVar235 * fVar251;
    fVar286 = auVar229._8_4_;
    auVar276._8_4_ = fVar286 * fVar236 * fVar254;
    fVar287 = auVar229._12_4_;
    auVar276._12_4_ = fVar287 * fVar220 * fVar222;
    fVar288 = auVar229._16_4_;
    auVar276._16_4_ = fVar288 * fVar221 * 0.0;
    fVar289 = auVar229._20_4_;
    auVar276._20_4_ = fVar289 * fVar239 * 0.0;
    fVar290 = auVar229._24_4_;
    auVar276._24_4_ = fVar290 * fVar240 * 0.0;
    auVar276._28_4_ = 0;
    auVar125 = vsubps_avx(ZEXT832(0) << 0x20,auVar177);
    auVar109 = vfmadd231ps_fma(auVar276,auVar125,auVar27);
    auVar29._4_4_ = fVar307 * fVar251;
    auVar29._0_4_ = fVar301 * fVar106;
    auVar29._8_4_ = fVar308 * fVar254;
    auVar29._12_4_ = fVar309 * fVar222;
    auVar29._16_4_ = fVar310 * 0.0;
    auVar29._20_4_ = fVar311 * 0.0;
    auVar29._24_4_ = fVar312 * 0.0;
    auVar29._28_4_ = uVar102;
    auVar110 = vfmadd231ps_fma(ZEXT1632(auVar110),auVar29,auVar280);
    auVar294 = ZEXT832(0) << 0x20;
    auVar247 = vsubps_avx(auVar294,auVar148);
    auVar109 = vfmadd231ps_fma(ZEXT1632(auVar109),auVar247,auVar29);
    auVar30._4_4_ = fVar272 * (float)local_a40._4_4_;
    auVar30._0_4_ = fVar271 * (float)local_a40._0_4_;
    auVar30._8_4_ = fVar286 * fStack_a38;
    auVar30._12_4_ = fVar287 * fStack_a34;
    auVar30._16_4_ = fVar288 * fStack_a30;
    auVar30._20_4_ = fVar289 * fStack_a2c;
    auVar30._24_4_ = fVar290 * fStack_a28;
    auVar30._28_4_ = uVar102;
    auVar168 = vfmadd231ps_fma(auVar30,_local_8e0,auVar125);
    auVar168 = vfmadd231ps_fma(ZEXT1632(auVar168),auVar280,auVar247);
    fVar273 = auVar109._0_4_;
    fVar239 = auVar110._0_4_;
    fVar252 = auVar109._4_4_;
    fVar240 = auVar110._4_4_;
    fVar256 = auVar109._8_4_;
    fVar257 = auVar110._8_4_;
    fVar231 = auVar109._12_4_;
    fVar270 = auVar110._12_4_;
    auVar31._28_4_ = local_8e0._28_4_;
    auVar31._0_28_ =
         ZEXT1628(CONCAT412(fVar270 * fVar231,
                            CONCAT48(fVar257 * fVar256,CONCAT44(fVar240 * fVar252,fVar239 * fVar273)
                                    )));
    auVar14 = vsubps_avx(ZEXT1632(auVar168),auVar31);
    auVar32._4_4_ = fVar272 * fVar272;
    auVar32._0_4_ = fVar271 * fVar271;
    auVar32._8_4_ = fVar286 * fVar286;
    auVar32._12_4_ = fVar287 * fVar287;
    auVar32._16_4_ = fVar288 * fVar288;
    auVar32._20_4_ = fVar289 * fVar289;
    auVar32._24_4_ = fVar290 * fVar290;
    auVar32._28_4_ = local_8e0._28_4_;
    auVar168 = vfmadd231ps_fma(auVar32,auVar125,auVar125);
    auVar168 = vfmadd231ps_fma(ZEXT1632(auVar168),auVar247,auVar247);
    auVar11._28_4_ = auVar12._28_4_;
    auVar11._0_28_ =
         ZEXT1628(CONCAT412(fVar231 * fVar231,
                            CONCAT48(fVar256 * fVar256,CONCAT44(fVar252 * fVar252,fVar273 * fVar273)
                                    )));
    auVar15 = vsubps_avx(ZEXT1632(auVar168),auVar11);
    auVar229 = vsqrtps_avx(auVar217);
    fVar221 = auVar229._28_4_ + auVar121._28_4_;
    fVar273 = (auVar229._0_4_ + auVar121._0_4_) * 1.0000002;
    fVar252 = (auVar229._4_4_ + auVar121._4_4_) * 1.0000002;
    fVar256 = (auVar229._8_4_ + auVar121._8_4_) * 1.0000002;
    fVar231 = (auVar229._12_4_ + auVar121._12_4_) * 1.0000002;
    fVar235 = (auVar229._16_4_ + auVar121._16_4_) * 1.0000002;
    fVar236 = (auVar229._20_4_ + auVar121._20_4_) * 1.0000002;
    fVar220 = (auVar229._24_4_ + auVar121._24_4_) * 1.0000002;
    auVar33._4_4_ = fVar252 * fVar252;
    auVar33._0_4_ = fVar273 * fVar273;
    auVar33._8_4_ = fVar256 * fVar256;
    auVar33._12_4_ = fVar231 * fVar231;
    auVar33._16_4_ = fVar235 * fVar235;
    auVar33._20_4_ = fVar236 * fVar236;
    auVar33._24_4_ = fVar220 * fVar220;
    auVar33._28_4_ = fVar221;
    auVar178._0_4_ = auVar14._0_4_ + auVar14._0_4_;
    auVar178._4_4_ = auVar14._4_4_ + auVar14._4_4_;
    auVar178._8_4_ = auVar14._8_4_ + auVar14._8_4_;
    auVar178._12_4_ = auVar14._12_4_ + auVar14._12_4_;
    auVar178._16_4_ = auVar14._16_4_ + auVar14._16_4_;
    auVar178._20_4_ = auVar14._20_4_ + auVar14._20_4_;
    auVar178._24_4_ = auVar14._24_4_ + auVar14._24_4_;
    fVar273 = auVar14._28_4_;
    auVar178._28_4_ = fVar273 + fVar273;
    auVar121 = vsubps_avx(auVar15,auVar33);
    auVar281 = ZEXT1632(auVar110);
    auVar34._28_4_ = DAT_0205d4a0._28_4_;
    auVar34._0_28_ =
         ZEXT1628(CONCAT412(fVar270 * fVar270,
                            CONCAT48(fVar257 * fVar257,CONCAT44(fVar240 * fVar240,fVar239 * fVar239)
                                    )));
    auVar14 = vsubps_avx(local_200,auVar34);
    auVar35._4_4_ = auVar178._4_4_ * auVar178._4_4_;
    auVar35._0_4_ = auVar178._0_4_ * auVar178._0_4_;
    auVar35._8_4_ = auVar178._8_4_ * auVar178._8_4_;
    auVar35._12_4_ = auVar178._12_4_ * auVar178._12_4_;
    auVar35._16_4_ = auVar178._16_4_ * auVar178._16_4_;
    auVar35._20_4_ = auVar178._20_4_ * auVar178._20_4_;
    auVar35._24_4_ = auVar178._24_4_ * auVar178._24_4_;
    auVar35._28_4_ = fVar221;
    fVar252 = auVar14._0_4_;
    fVar256 = auVar14._4_4_;
    fVar231 = auVar14._8_4_;
    fVar235 = auVar14._12_4_;
    fVar236 = auVar14._16_4_;
    fVar220 = auVar14._20_4_;
    fVar221 = auVar14._24_4_;
    auVar36._4_4_ = fVar256 * 4.0 * auVar121._4_4_;
    auVar36._0_4_ = fVar252 * 4.0 * auVar121._0_4_;
    auVar36._8_4_ = fVar231 * 4.0 * auVar121._8_4_;
    auVar36._12_4_ = fVar235 * 4.0 * auVar121._12_4_;
    auVar36._16_4_ = fVar236 * 4.0 * auVar121._16_4_;
    auVar36._20_4_ = fVar220 * 4.0 * auVar121._20_4_;
    auVar36._24_4_ = fVar221 * 4.0 * auVar121._24_4_;
    auVar36._28_4_ = fVar273;
    auVar16 = vsubps_avx(auVar35,auVar36);
    auVar217 = vcmpps_avx(auVar16,auVar294,5);
    auVar277 = ZEXT1632(auVar109);
    fVar273 = auVar14._28_4_;
    if ((((((((auVar217 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar217 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar217 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar217 >> 0x7f,0) == '\0') &&
          (auVar217 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar217 >> 0xbf,0) == '\0') &&
        (auVar217 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar217[0x1f])
    {
      local_ca0._8_4_ = 0x7f800000;
      local_ca0._0_8_ = 0x7f8000007f800000;
      local_ca0._12_4_ = 0x7f800000;
      local_ca0._16_4_ = 0x7f800000;
      local_ca0._20_4_ = 0x7f800000;
      local_ca0._24_4_ = 0x7f800000;
      local_ca0._28_4_ = 0x7f800000;
      auVar208._8_4_ = 0xff800000;
      auVar208._0_8_ = 0xff800000ff800000;
      auVar208._12_4_ = 0xff800000;
      auVar208._16_4_ = 0xff800000;
      auVar208._20_4_ = 0xff800000;
      auVar208._24_4_ = 0xff800000;
      auVar208._28_4_ = 0xff800000;
      auVar294 = local_200;
    }
    else {
      auVar294 = vcmpps_avx(auVar16,auVar294,5);
      auVar16 = vsqrtps_avx(auVar16);
      auVar302._0_4_ = fVar252 + fVar252;
      auVar302._4_4_ = fVar256 + fVar256;
      auVar302._8_4_ = fVar231 + fVar231;
      auVar302._12_4_ = fVar235 + fVar235;
      auVar302._16_4_ = fVar236 + fVar236;
      auVar302._20_4_ = fVar220 + fVar220;
      auVar302._24_4_ = fVar221 + fVar221;
      auVar302._28_4_ = fVar273 + fVar273;
      auVar11 = vrcpps_avx(auVar302);
      auVar179._8_4_ = 0x3f800000;
      auVar179._0_8_ = &DAT_3f8000003f800000;
      auVar179._12_4_ = 0x3f800000;
      auVar179._16_4_ = 0x3f800000;
      auVar179._20_4_ = 0x3f800000;
      auVar179._24_4_ = 0x3f800000;
      auVar179._28_4_ = 0x3f800000;
      auVar110 = vfnmadd213ps_fma(auVar302,auVar11,auVar179);
      auVar110 = vfmadd132ps_fma(ZEXT1632(auVar110),auVar11,auVar11);
      auVar295._0_4_ = (uint)auVar178._0_4_ ^ local_7e0;
      auVar295._4_4_ = (uint)auVar178._4_4_ ^ uStack_7dc;
      auVar295._8_4_ = (uint)auVar178._8_4_ ^ uStack_7d8;
      auVar295._12_4_ = (uint)auVar178._12_4_ ^ uStack_7d4;
      auVar295._16_4_ = (uint)auVar178._16_4_ ^ (uint)fStack_7d0;
      auVar295._20_4_ = (uint)auVar178._20_4_ ^ (uint)fStack_7cc;
      auVar295._24_4_ = (uint)auVar178._24_4_ ^ (uint)fStack_7c8;
      auVar295._28_4_ = (uint)auVar178._28_4_ ^ uStack_7c4;
      auVar11 = vsubps_avx(auVar295,auVar16);
      auVar37._4_4_ = auVar11._4_4_ * auVar110._4_4_;
      auVar37._0_4_ = auVar11._0_4_ * auVar110._0_4_;
      auVar37._8_4_ = auVar11._8_4_ * auVar110._8_4_;
      auVar37._12_4_ = auVar11._12_4_ * auVar110._12_4_;
      auVar37._16_4_ = auVar11._16_4_ * 0.0;
      auVar37._20_4_ = auVar11._20_4_ * 0.0;
      auVar37._24_4_ = auVar11._24_4_ * 0.0;
      auVar37._28_4_ = auVar11._28_4_;
      auVar11 = vsubps_avx(auVar16,auVar178);
      auVar38._4_4_ = auVar110._4_4_ * auVar11._4_4_;
      auVar38._0_4_ = auVar110._0_4_ * auVar11._0_4_;
      auVar38._8_4_ = auVar110._8_4_ * auVar11._8_4_;
      auVar38._12_4_ = auVar110._12_4_ * auVar11._12_4_;
      auVar38._16_4_ = auVar11._16_4_ * 0.0;
      auVar38._20_4_ = auVar11._20_4_ * 0.0;
      auVar38._24_4_ = auVar11._24_4_ * 0.0;
      auVar38._28_4_ = auVar11._28_4_;
      auVar110 = vfmadd213ps_fma(auVar281,auVar37,auVar277);
      local_660 = ZEXT1632(CONCAT412(auVar110._12_4_ * fVar222,
                                     CONCAT48(auVar110._8_4_ * fVar254,
                                              CONCAT44(auVar110._4_4_ * fVar251,
                                                       auVar110._0_4_ * fVar106))));
      auVar110 = vfmadd213ps_fma(auVar281,auVar38,auVar277);
      local_680 = ZEXT1632(CONCAT412(auVar110._12_4_ * fVar222,
                                     CONCAT48(auVar110._8_4_ * fVar254,
                                              CONCAT44(auVar110._4_4_ * fVar251,
                                                       auVar110._0_4_ * fVar106))));
      auVar149._8_4_ = 0x7f800000;
      auVar149._0_8_ = 0x7f8000007f800000;
      auVar149._12_4_ = 0x7f800000;
      auVar149._16_4_ = 0x7f800000;
      auVar149._20_4_ = 0x7f800000;
      auVar149._24_4_ = 0x7f800000;
      auVar149._28_4_ = 0x7f800000;
      local_ca0 = vblendvps_avx(auVar149,auVar37,auVar294);
      auVar68._4_4_ = uStack_8fc;
      auVar68._0_4_ = local_900;
      auVar68._8_4_ = uStack_8f8;
      auVar68._12_4_ = uStack_8f4;
      auVar68._16_4_ = uStack_8f0;
      auVar68._20_4_ = uStack_8ec;
      auVar68._24_4_ = uStack_8e8;
      auVar68._28_4_ = uStack_8e4;
      auVar11 = vandps_avx(auVar34,auVar68);
      auVar11 = vmaxps_avx(local_5c0,auVar11);
      auVar17._4_4_ = auVar11._4_4_ * 1.9073486e-06;
      auVar17._0_4_ = auVar11._0_4_ * 1.9073486e-06;
      auVar17._8_4_ = auVar11._8_4_ * 1.9073486e-06;
      auVar17._12_4_ = auVar11._12_4_ * 1.9073486e-06;
      auVar17._16_4_ = auVar11._16_4_ * 1.9073486e-06;
      auVar17._20_4_ = auVar11._20_4_ * 1.9073486e-06;
      auVar17._24_4_ = auVar11._24_4_ * 1.9073486e-06;
      auVar17._28_4_ = auVar11._28_4_;
      auVar11 = vandps_avx(auVar14,auVar68);
      auVar11 = vcmpps_avx(auVar11,auVar17,1);
      auVar150._8_4_ = 0xff800000;
      auVar150._0_8_ = 0xff800000ff800000;
      auVar150._12_4_ = 0xff800000;
      auVar150._16_4_ = 0xff800000;
      auVar150._20_4_ = 0xff800000;
      auVar150._24_4_ = 0xff800000;
      auVar150._28_4_ = 0xff800000;
      auVar208 = vblendvps_avx(auVar150,auVar38,auVar294);
      auVar16 = auVar294 & auVar11;
      if ((((((((auVar16 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar16 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar16 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar16 >> 0x7f,0) != '\0') ||
            (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar16 >> 0xbf,0) != '\0') ||
          (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar16[0x1f] < '\0') {
        auVar217 = vandps_avx(auVar11,auVar294);
        auVar16 = vcmpps_avx(auVar121,_DAT_02020f00,2);
        auVar130._8_4_ = 0xff800000;
        auVar130._0_8_ = 0xff800000ff800000;
        auVar130._12_4_ = 0xff800000;
        auVar130._16_4_ = 0xff800000;
        auVar130._20_4_ = 0xff800000;
        auVar130._24_4_ = 0xff800000;
        auVar130._28_4_ = 0xff800000;
        auVar165._8_4_ = 0x7f800000;
        auVar165._0_8_ = 0x7f8000007f800000;
        auVar165._12_4_ = 0x7f800000;
        auVar165._16_4_ = 0x7f800000;
        auVar165._20_4_ = 0x7f800000;
        auVar165._24_4_ = 0x7f800000;
        auVar165._28_4_ = 0x7f800000;
        auVar121 = vblendvps_avx(auVar165,auVar130,auVar16);
        auVar110 = vpackssdw_avx(auVar217._0_16_,auVar217._16_16_);
        auVar17 = vpmovsxwd_avx2(auVar110);
        local_ca0 = vblendvps_avx(local_ca0,auVar121,auVar17);
        auVar11 = vblendvps_avx(auVar130,auVar165,auVar16);
        auVar208 = vblendvps_avx(auVar208,auVar11,auVar17);
        auVar219._0_8_ = auVar217._0_8_ ^ 0xffffffffffffffff;
        auVar219._8_4_ = auVar217._8_4_ ^ 0xffffffff;
        auVar219._12_4_ = auVar217._12_4_ ^ 0xffffffff;
        auVar219._16_4_ = auVar217._16_4_ ^ 0xffffffff;
        auVar219._20_4_ = auVar217._20_4_ ^ 0xffffffff;
        auVar219._24_4_ = auVar217._24_4_ ^ 0xffffffff;
        auVar219._28_4_ = auVar217._28_4_ ^ 0xffffffff;
        auVar217 = vorps_avx(auVar16,auVar219);
        auVar217 = vandps_avx(auVar294,auVar217);
      }
      auVar300 = ZEXT3264(auVar17);
    }
    auVar306 = ZEXT3264(auVar11);
    auVar269 = ZEXT3264(auVar294);
    auVar121 = local_220 & auVar217;
    if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar121 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar121 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar121 >> 0x7f,0) != '\0') ||
          (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar121 >> 0xbf,0) != '\0') ||
        (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar121[0x1f] < '\0') {
      fVar239 = *(float *)(ray + k * 4 + 0x100) - (float)local_990._0_4_;
      auVar246._4_4_ = fVar239;
      auVar246._0_4_ = fVar239;
      auVar246._8_4_ = fVar239;
      auVar246._12_4_ = fVar239;
      auVar246._16_4_ = fVar239;
      auVar246._20_4_ = fVar239;
      auVar246._24_4_ = fVar239;
      auVar246._28_4_ = fVar239;
      auVar16 = vminps_avx(auVar246,auVar208);
      auVar39._4_4_ = fVar272 * fVar319;
      auVar39._0_4_ = fVar271 * fVar318;
      auVar39._8_4_ = fVar286 * fVar320;
      auVar39._12_4_ = fVar287 * fVar321;
      auVar39._16_4_ = fVar288 * fVar322;
      auVar39._20_4_ = fVar289 * fVar323;
      auVar39._24_4_ = fVar290 * fVar324;
      auVar39._28_4_ = fVar239;
      auVar110 = vfmadd213ps_fma(auVar125,auVar21,auVar39);
      auVar109 = vfmadd213ps_fma(auVar247,local_7c0,ZEXT1632(auVar110));
      auVar40._4_4_ = fVar319 * (float)local_a40._4_4_;
      auVar40._0_4_ = fVar318 * (float)local_a40._0_4_;
      auVar40._8_4_ = fVar320 * fStack_a38;
      auVar40._12_4_ = fVar321 * fStack_a34;
      auVar40._16_4_ = fVar322 * fStack_a30;
      auVar40._20_4_ = fVar323 * fStack_a2c;
      auVar40._24_4_ = fVar324 * fStack_a28;
      auVar40._28_4_ = fVar239;
      auVar110 = vfmadd231ps_fma(auVar40,_local_8e0,auVar21);
      auVar168 = vfmadd231ps_fma(ZEXT1632(auVar110),auVar280,local_7c0);
      auVar69._4_4_ = uStack_8fc;
      auVar69._0_4_ = local_900;
      auVar69._8_4_ = uStack_8f8;
      auVar69._12_4_ = uStack_8f4;
      auVar69._16_4_ = uStack_8f0;
      auVar69._20_4_ = uStack_8ec;
      auVar69._24_4_ = uStack_8e8;
      auVar69._28_4_ = uStack_8e4;
      auVar121 = vandps_avx(ZEXT1632(auVar168),auVar69);
      auVar151._8_4_ = 0x219392ef;
      auVar151._0_8_ = 0x219392ef219392ef;
      auVar151._12_4_ = 0x219392ef;
      auVar151._16_4_ = 0x219392ef;
      auVar151._20_4_ = 0x219392ef;
      auVar151._24_4_ = 0x219392ef;
      auVar151._28_4_ = 0x219392ef;
      auVar11 = vcmpps_avx(auVar121,auVar151,1);
      auVar121 = vrcpps_avx(ZEXT1632(auVar168));
      auVar303._8_4_ = 0x3f800000;
      auVar303._0_8_ = &DAT_3f8000003f800000;
      auVar303._12_4_ = 0x3f800000;
      auVar303._16_4_ = 0x3f800000;
      auVar303._20_4_ = 0x3f800000;
      auVar303._24_4_ = 0x3f800000;
      auVar303._28_4_ = 0x3f800000;
      auVar247 = ZEXT1632(auVar168);
      auVar110 = vfnmadd213ps_fma(auVar121,auVar247,auVar303);
      auVar110 = vfmadd132ps_fma(ZEXT1632(auVar110),auVar121,auVar121);
      auVar284._0_4_ = auVar168._0_4_ ^ local_7e0;
      auVar284._4_4_ = auVar168._4_4_ ^ uStack_7dc;
      auVar284._8_4_ = auVar168._8_4_ ^ uStack_7d8;
      auVar284._12_4_ = auVar168._12_4_ ^ uStack_7d4;
      auVar284._16_4_ = fStack_7d0;
      auVar284._20_4_ = fStack_7cc;
      auVar284._24_4_ = fStack_7c8;
      auVar284._28_4_ = uStack_7c4;
      auVar296._0_4_ = auVar110._0_4_ * (float)(auVar109._0_4_ ^ local_7e0);
      auVar296._4_4_ = auVar110._4_4_ * (float)(auVar109._4_4_ ^ uStack_7dc);
      auVar296._8_4_ = auVar110._8_4_ * (float)(auVar109._8_4_ ^ uStack_7d8);
      auVar296._12_4_ = auVar110._12_4_ * (float)(auVar109._12_4_ ^ uStack_7d4);
      auVar296._16_4_ = fStack_7d0 * 0.0;
      auVar296._20_4_ = fStack_7cc * 0.0;
      auVar296._24_4_ = fStack_7c8 * 0.0;
      auVar296._28_4_ = 0;
      auVar121 = vcmpps_avx(auVar247,auVar284,1);
      auVar121 = vorps_avx(auVar11,auVar121);
      auVar304._8_4_ = 0xff800000;
      auVar304._0_8_ = 0xff800000ff800000;
      auVar304._12_4_ = 0xff800000;
      auVar304._16_4_ = 0xff800000;
      auVar304._20_4_ = 0xff800000;
      auVar304._24_4_ = 0xff800000;
      auVar304._28_4_ = 0xff800000;
      auVar121 = vblendvps_avx(auVar296,auVar304,auVar121);
      auVar90._4_4_ = fStack_25c;
      auVar90._0_4_ = local_260;
      auVar90._8_4_ = fStack_258;
      auVar90._12_4_ = fStack_254;
      auVar90._16_4_ = fStack_250;
      auVar90._20_4_ = fStack_24c;
      auVar90._24_4_ = fStack_248;
      auVar90._28_4_ = fStack_244;
      auVar125 = vmaxps_avx(auVar90,local_ca0);
      auVar125 = vmaxps_avx(auVar125,auVar121);
      auVar121 = vcmpps_avx(auVar247,auVar284,6);
      auVar121 = vorps_avx(auVar11,auVar121);
      auVar264._8_4_ = 0x7f800000;
      auVar264._0_8_ = 0x7f8000007f800000;
      auVar264._12_4_ = 0x7f800000;
      auVar264._16_4_ = 0x7f800000;
      auVar264._20_4_ = 0x7f800000;
      auVar264._24_4_ = 0x7f800000;
      auVar264._28_4_ = 0x7f800000;
      auVar121 = vblendvps_avx(auVar296,auVar264,auVar121);
      auVar247 = vminps_avx(auVar16,auVar121);
      auVar121 = vsubps_avx(ZEXT832(0) << 0x20,_local_9e0);
      auVar11 = vsubps_avx(ZEXT832(0) << 0x20,auVar248);
      auVar41._4_4_ = auVar11._4_4_ * fVar250;
      auVar41._0_4_ = auVar11._0_4_ * fVar241;
      auVar41._8_4_ = auVar11._8_4_ * fVar253;
      auVar41._12_4_ = auVar11._12_4_ * fVar255;
      auVar41._16_4_ = auVar11._16_4_ * fVar232;
      auVar41._20_4_ = auVar11._20_4_ * fVar233;
      auVar41._24_4_ = auVar11._24_4_ * fVar234;
      auVar41._28_4_ = auVar11._28_4_;
      auVar110 = vfnmsub231ps_fma(auVar41,auVar19,auVar121);
      auVar121 = vsubps_avx(ZEXT832(0) << 0x20,local_a20);
      auVar109 = vfnmadd231ps_fma(ZEXT1632(auVar110),auVar18,auVar121);
      auVar42._4_4_ = fVar250 * (float)local_a40._4_4_;
      auVar42._0_4_ = fVar241 * (float)local_a40._0_4_;
      auVar42._8_4_ = fVar253 * fStack_a38;
      auVar42._12_4_ = fVar255 * fStack_a34;
      auVar42._16_4_ = fVar232 * fStack_a30;
      auVar42._20_4_ = fVar233 * fStack_a2c;
      auVar42._24_4_ = fVar234 * fStack_a28;
      auVar42._28_4_ = auVar121._28_4_;
      auVar110 = vfnmsub231ps_fma(auVar42,auVar19,_local_8e0);
      auVar168 = vfnmadd231ps_fma(ZEXT1632(auVar110),auVar280,auVar18);
      auVar317._8_4_ = 0x3f800000;
      auVar317._0_8_ = &DAT_3f8000003f800000;
      auVar317._12_4_ = 0x3f800000;
      auVar317._16_4_ = 0x3f800000;
      auVar317._20_4_ = 0x3f800000;
      auVar317._24_4_ = 0x3f800000;
      auVar317._28_4_ = 0x3f800000;
      auVar121 = vandps_avx(ZEXT1632(auVar168),auVar69);
      auVar16 = vrcpps_avx(ZEXT1632(auVar168));
      auVar180._8_4_ = 0x219392ef;
      auVar180._0_8_ = 0x219392ef219392ef;
      auVar180._12_4_ = 0x219392ef;
      auVar180._16_4_ = 0x219392ef;
      auVar180._20_4_ = 0x219392ef;
      auVar180._24_4_ = 0x219392ef;
      auVar180._28_4_ = 0x219392ef;
      auVar11 = vcmpps_avx(auVar121,auVar180,1);
      auVar285 = ZEXT3264(auVar11);
      auVar248 = ZEXT1632(auVar168);
      auVar110 = vfnmadd213ps_fma(auVar16,auVar248,auVar317);
      auVar110 = vfmadd132ps_fma(ZEXT1632(auVar110),auVar16,auVar16);
      auVar297._0_4_ = auVar168._0_4_ ^ local_7e0;
      auVar297._4_4_ = auVar168._4_4_ ^ uStack_7dc;
      auVar297._8_4_ = auVar168._8_4_ ^ uStack_7d8;
      auVar297._12_4_ = auVar168._12_4_ ^ uStack_7d4;
      auVar297._16_4_ = fStack_7d0;
      auVar297._20_4_ = fStack_7cc;
      auVar297._24_4_ = fStack_7c8;
      auVar297._28_4_ = uStack_7c4;
      auVar300 = ZEXT3264(auVar297);
      auVar43._4_4_ = auVar110._4_4_ * (float)(auVar109._4_4_ ^ uStack_7dc);
      auVar43._0_4_ = auVar110._0_4_ * (float)(auVar109._0_4_ ^ local_7e0);
      auVar43._8_4_ = auVar110._8_4_ * (float)(auVar109._8_4_ ^ uStack_7d8);
      auVar43._12_4_ = auVar110._12_4_ * (float)(auVar109._12_4_ ^ uStack_7d4);
      auVar43._16_4_ = fStack_7d0 * 0.0;
      auVar43._20_4_ = fStack_7cc * 0.0;
      auVar43._24_4_ = fStack_7c8 * 0.0;
      auVar43._28_4_ = uStack_7c4;
      auVar269 = ZEXT3264(auVar43);
      auVar121 = vcmpps_avx(auVar248,auVar297,1);
      auVar121 = vorps_avx(auVar11,auVar121);
      auVar152._8_4_ = 0xff800000;
      auVar152._0_8_ = 0xff800000ff800000;
      auVar152._12_4_ = 0xff800000;
      auVar152._16_4_ = 0xff800000;
      auVar152._20_4_ = 0xff800000;
      auVar152._24_4_ = 0xff800000;
      auVar152._28_4_ = 0xff800000;
      auVar121 = vblendvps_avx(auVar43,auVar152,auVar121);
      auVar306 = ZEXT3264(auVar121);
      _local_8c0 = vmaxps_avx(auVar125,auVar121);
      auVar121 = vcmpps_avx(auVar248,auVar297,6);
      auVar121 = vorps_avx(auVar11,auVar121);
      auVar181._8_4_ = 0x7f800000;
      auVar181._0_8_ = 0x7f8000007f800000;
      auVar181._12_4_ = 0x7f800000;
      auVar181._16_4_ = 0x7f800000;
      auVar181._20_4_ = 0x7f800000;
      auVar181._24_4_ = 0x7f800000;
      auVar181._28_4_ = 0x7f800000;
      auVar121 = vblendvps_avx(auVar43,auVar181,auVar121);
      auVar217 = vandps_avx(auVar217,local_220);
      local_2a0 = vminps_avx(auVar247,auVar121);
      auVar121 = vcmpps_avx(_local_8c0,local_2a0,2);
      auVar11 = auVar217 & auVar121;
      if ((((((((auVar11 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar11 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar11 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar11 >> 0x7f,0) != '\0') ||
            (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar11 >> 0xbf,0) != '\0') ||
          (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar11[0x1f] < '\0') {
        auVar11 = vminps_avx(local_660,auVar317);
        auVar57 = ZEXT412(0);
        auVar300 = ZEXT1264(auVar57) << 0x20;
        auVar11 = vmaxps_avx(auVar11,ZEXT1232(auVar57) << 0x20);
        auVar125 = vminps_avx(local_680,auVar317);
        auVar125 = vmaxps_avx(auVar125,ZEXT1232(auVar57) << 0x20);
        fVar241 = DAT_02020f40._28_4_;
        auVar44._4_4_ = (auVar11._4_4_ + DAT_02020f40._4_4_) * 0.125;
        auVar44._0_4_ = (auVar11._0_4_ + (float)DAT_02020f40) * 0.125;
        auVar44._8_4_ = (auVar11._8_4_ + DAT_02020f40._8_4_) * 0.125;
        auVar44._12_4_ = (auVar11._12_4_ + DAT_02020f40._12_4_) * 0.125;
        auVar44._16_4_ = (auVar11._16_4_ + DAT_02020f40._16_4_) * 0.125;
        auVar44._20_4_ = (auVar11._20_4_ + DAT_02020f40._20_4_) * 0.125;
        auVar44._24_4_ = (auVar11._24_4_ + DAT_02020f40._24_4_) * 0.125;
        auVar44._28_4_ = auVar11._28_4_ + fVar241;
        auVar306 = ZEXT3264(local_820);
        auVar110 = vfmadd213ps_fma(auVar44,local_820,local_a60);
        auVar45._4_4_ = (auVar125._4_4_ + DAT_02020f40._4_4_) * 0.125;
        auVar45._0_4_ = (auVar125._0_4_ + (float)DAT_02020f40) * 0.125;
        auVar45._8_4_ = (auVar125._8_4_ + DAT_02020f40._8_4_) * 0.125;
        auVar45._12_4_ = (auVar125._12_4_ + DAT_02020f40._12_4_) * 0.125;
        auVar45._16_4_ = (auVar125._16_4_ + DAT_02020f40._16_4_) * 0.125;
        auVar45._20_4_ = (auVar125._20_4_ + DAT_02020f40._20_4_) * 0.125;
        auVar45._24_4_ = (auVar125._24_4_ + DAT_02020f40._24_4_) * 0.125;
        auVar45._28_4_ = auVar125._28_4_ + fVar241;
        auVar109 = vfmadd213ps_fma(auVar45,local_820,local_a60);
        auVar11 = vminps_avx(local_840,auVar263);
        auVar125 = vminps_avx(local_880,auVar20);
        auVar11 = vminps_avx(auVar11,auVar125);
        auVar229 = vsubps_avx(auVar11,auVar229);
        auVar217 = vandps_avx(auVar121,auVar217);
        local_660 = ZEXT1632(auVar110);
        local_680 = ZEXT1632(auVar109);
        auVar46._4_4_ = auVar229._4_4_ * 0.99999976;
        auVar46._0_4_ = auVar229._0_4_ * 0.99999976;
        auVar46._8_4_ = auVar229._8_4_ * 0.99999976;
        auVar46._12_4_ = auVar229._12_4_ * 0.99999976;
        auVar46._16_4_ = auVar229._16_4_ * 0.99999976;
        auVar46._20_4_ = auVar229._20_4_ * 0.99999976;
        auVar46._24_4_ = auVar229._24_4_ * 0.99999976;
        auVar46._28_4_ = auVar229._28_4_;
        auVar229 = vmaxps_avx(ZEXT832(0) << 0x20,auVar46);
        auVar47._4_4_ = auVar229._4_4_ * auVar229._4_4_;
        auVar47._0_4_ = auVar229._0_4_ * auVar229._0_4_;
        auVar47._8_4_ = auVar229._8_4_ * auVar229._8_4_;
        auVar47._12_4_ = auVar229._12_4_ * auVar229._12_4_;
        auVar47._16_4_ = auVar229._16_4_ * auVar229._16_4_;
        auVar47._20_4_ = auVar229._20_4_ * auVar229._20_4_;
        auVar47._24_4_ = auVar229._24_4_ * auVar229._24_4_;
        auVar47._28_4_ = auVar229._28_4_;
        auVar121 = vsubps_avx(auVar15,auVar47);
        auVar48._4_4_ = auVar121._4_4_ * fVar256 * 4.0;
        auVar48._0_4_ = auVar121._0_4_ * fVar252 * 4.0;
        auVar48._8_4_ = auVar121._8_4_ * fVar231 * 4.0;
        auVar48._12_4_ = auVar121._12_4_ * fVar235 * 4.0;
        auVar48._16_4_ = auVar121._16_4_ * fVar236 * 4.0;
        auVar48._20_4_ = auVar121._20_4_ * fVar220 * 4.0;
        auVar48._24_4_ = auVar121._24_4_ * fVar221 * 4.0;
        auVar48._28_4_ = auVar229._28_4_;
        auVar11 = vsubps_avx(auVar35,auVar48);
        auVar285 = ZEXT3264(auVar11);
        auVar125 = SUB6432(ZEXT864(0),0) << 0x20;
        local_940 = ZEXT832(0) << 0x20;
        auVar229 = vcmpps_avx(auVar11,ZEXT1232(auVar57) << 0x20,5);
        if ((((((((auVar229 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar229 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar229 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar229 >> 0x7f,0) == '\0') &&
              (auVar229 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar229 >> 0xbf,0) == '\0') &&
            (auVar229 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar229[0x1f]) {
          _local_960 = ZEXT832(0) << 0x20;
          auVar153 = ZEXT1632(ZEXT816(0) << 0x40);
          auVar189 = ZEXT864(0) << 0x20;
          auVar249._8_4_ = 0x7f800000;
          auVar249._0_8_ = 0x7f8000007f800000;
          auVar249._12_4_ = 0x7f800000;
          auVar249._16_4_ = 0x7f800000;
          auVar249._20_4_ = 0x7f800000;
          auVar249._24_4_ = 0x7f800000;
          auVar249._28_4_ = 0x7f800000;
          auVar269 = ZEXT3264(CONCAT428(0xff800000,
                                        CONCAT424(0xff800000,
                                                  CONCAT420(0xff800000,
                                                            CONCAT416(0xff800000,
                                                                      CONCAT412(0xff800000,
                                                                                CONCAT48(0xff800000,
                                                                                                                                                                                  
                                                  0xff800000ff800000)))))));
          _local_920 = local_940;
        }
        else {
          auVar247 = vsqrtps_avx(auVar11);
          local_280 = auVar14;
          auVar265._0_4_ = fVar252 + fVar252;
          auVar265._4_4_ = fVar256 + fVar256;
          auVar265._8_4_ = fVar231 + fVar231;
          auVar265._12_4_ = fVar235 + fVar235;
          auVar265._16_4_ = fVar236 + fVar236;
          auVar265._20_4_ = fVar220 + fVar220;
          auVar265._24_4_ = fVar221 + fVar221;
          auVar265._28_4_ = fVar273 + fVar273;
          auVar125 = vrcpps_avx(auVar265);
          auVar110 = vfnmadd213ps_fma(auVar265,auVar125,auVar317);
          auVar110 = vfmadd132ps_fma(ZEXT1632(auVar110),auVar125,auVar125);
          auVar298._0_4_ = (uint)auVar178._0_4_ ^ local_7e0;
          auVar298._4_4_ = (uint)auVar178._4_4_ ^ uStack_7dc;
          auVar298._8_4_ = (uint)auVar178._8_4_ ^ uStack_7d8;
          auVar298._12_4_ = (uint)auVar178._12_4_ ^ uStack_7d4;
          auVar298._16_4_ = (uint)auVar178._16_4_ ^ (uint)fStack_7d0;
          auVar298._20_4_ = (uint)auVar178._20_4_ ^ (uint)fStack_7cc;
          auVar298._24_4_ = (uint)auVar178._24_4_ ^ (uint)fStack_7c8;
          auVar298._28_4_ = (uint)auVar178._28_4_ ^ uStack_7c4;
          auVar125 = vsubps_avx(auVar298,auVar247);
          auVar15 = vsubps_avx(auVar247,auVar178);
          fVar273 = auVar125._0_4_ * auVar110._0_4_;
          fVar250 = auVar125._4_4_ * auVar110._4_4_;
          auVar49._4_4_ = fVar250;
          auVar49._0_4_ = fVar273;
          fVar252 = auVar125._8_4_ * auVar110._8_4_;
          auVar49._8_4_ = fVar252;
          fVar253 = auVar125._12_4_ * auVar110._12_4_;
          auVar49._12_4_ = fVar253;
          fVar256 = auVar125._16_4_ * 0.0;
          auVar49._16_4_ = fVar256;
          fVar255 = auVar125._20_4_ * 0.0;
          auVar49._20_4_ = fVar255;
          fVar231 = auVar125._24_4_ * 0.0;
          auVar49._24_4_ = fVar231;
          auVar49._28_4_ = auVar247._28_4_;
          fVar232 = auVar15._0_4_ * auVar110._0_4_;
          fVar233 = auVar15._4_4_ * auVar110._4_4_;
          auVar50._4_4_ = fVar233;
          auVar50._0_4_ = fVar232;
          fVar234 = auVar15._8_4_ * auVar110._8_4_;
          auVar50._8_4_ = fVar234;
          fVar235 = auVar15._12_4_ * auVar110._12_4_;
          auVar50._12_4_ = fVar235;
          fVar236 = auVar15._16_4_ * 0.0;
          auVar50._16_4_ = fVar236;
          fVar220 = auVar15._20_4_ * 0.0;
          auVar50._20_4_ = fVar220;
          fVar221 = auVar15._24_4_ * 0.0;
          auVar50._24_4_ = fVar221;
          auVar50._28_4_ = auVar125._28_4_;
          auVar300 = ZEXT3264(auVar50);
          auVar110 = vfmadd213ps_fma(auVar281,auVar49,auVar277);
          auVar109 = vfmadd213ps_fma(auVar281,auVar50,auVar277);
          auVar125 = ZEXT1632(CONCAT412(fVar222 * auVar110._12_4_,
                                        CONCAT48(fVar254 * auVar110._8_4_,
                                                 CONCAT44(fVar251 * auVar110._4_4_,
                                                          fVar106 * auVar110._0_4_))));
          auVar247 = ZEXT1632(CONCAT412(fVar222 * auVar109._12_4_,
                                        CONCAT48(fVar254 * auVar109._8_4_,
                                                 CONCAT44(fVar251 * auVar109._4_4_,
                                                          fVar106 * auVar109._0_4_))));
          auVar110 = vfmadd213ps_fma(auVar12,auVar125,auVar148);
          auVar109 = vfmadd213ps_fma(auVar12,auVar247,auVar148);
          auVar168 = vfmadd213ps_fma(auVar153,auVar125,auVar177);
          auVar136 = vfmadd213ps_fma(auVar153,auVar247,auVar177);
          auVar108 = vfmadd213ps_fma(auVar125,auVar13,auVar316);
          auVar116 = vfmadd213ps_fma(auVar13,auVar247,auVar316);
          auVar306 = ZEXT1664(auVar116);
          auVar51._4_4_ = fVar105 * fVar250;
          auVar51._0_4_ = fVar105 * fVar273;
          auVar51._8_4_ = fVar105 * fVar252;
          auVar51._12_4_ = fVar105 * fVar253;
          auVar51._16_4_ = fVar105 * fVar256;
          auVar51._20_4_ = fVar105 * fVar255;
          auVar51._24_4_ = fVar105 * fVar231;
          auVar51._28_4_ = 0;
          auVar125 = vsubps_avx(auVar51,ZEXT1632(auVar110));
          auVar95._4_4_ = (float)local_8e0._4_4_ * fVar250;
          auVar95._0_4_ = (float)local_8e0._0_4_ * fVar273;
          auVar95._8_4_ = fStack_8d8 * fVar252;
          auVar95._12_4_ = fStack_8d4 * fVar253;
          auVar95._16_4_ = fStack_8d0 * fVar256;
          auVar95._20_4_ = fStack_8cc * fVar255;
          auVar95._24_4_ = fStack_8c8 * fVar231;
          auVar95._28_4_ = fVar241;
          auVar153 = vsubps_avx(auVar95,ZEXT1632(auVar168));
          auVar182._0_4_ = (float)local_a40._0_4_ * fVar273;
          auVar182._4_4_ = (float)local_a40._4_4_ * fVar250;
          auVar182._8_4_ = fStack_a38 * fVar252;
          auVar182._12_4_ = fStack_a34 * fVar253;
          auVar182._16_4_ = fStack_a30 * fVar256;
          auVar182._20_4_ = fStack_a2c * fVar255;
          auVar182._24_4_ = fStack_a28 * fVar231;
          auVar182._28_4_ = 0;
          auVar12 = vsubps_avx(auVar182,ZEXT1632(auVar108));
          auVar189 = ZEXT3264(auVar12);
          auVar266._0_4_ = fVar105 * fVar232;
          auVar266._4_4_ = fVar105 * fVar233;
          auVar266._8_4_ = fVar105 * fVar234;
          auVar266._12_4_ = fVar105 * fVar235;
          auVar266._16_4_ = fVar105 * fVar236;
          auVar266._20_4_ = fVar105 * fVar220;
          auVar266._24_4_ = fVar105 * fVar221;
          auVar266._28_4_ = 0;
          _local_920 = vsubps_avx(auVar266,ZEXT1632(auVar109));
          auVar52._4_4_ = (float)local_8e0._4_4_ * fVar233;
          auVar52._0_4_ = (float)local_8e0._0_4_ * fVar232;
          auVar52._8_4_ = fStack_8d8 * fVar234;
          auVar52._12_4_ = fStack_8d4 * fVar235;
          auVar52._16_4_ = fStack_8d0 * fVar236;
          auVar52._20_4_ = fStack_8cc * fVar220;
          auVar52._24_4_ = fStack_8c8 * fVar221;
          auVar52._28_4_ = local_920._28_4_;
          local_940 = vsubps_avx(auVar52,ZEXT1632(auVar136));
          auVar53._4_4_ = (float)local_a40._4_4_ * fVar233;
          auVar53._0_4_ = (float)local_a40._0_4_ * fVar232;
          auVar53._8_4_ = fStack_a38 * fVar234;
          auVar53._12_4_ = fStack_a34 * fVar235;
          auVar53._16_4_ = fStack_a30 * fVar236;
          auVar53._20_4_ = fStack_a2c * fVar220;
          auVar53._24_4_ = fStack_a28 * fVar221;
          auVar53._28_4_ = local_940._28_4_;
          _local_960 = vsubps_avx(auVar53,ZEXT1632(auVar116));
          auVar12 = vcmpps_avx(auVar11,_DAT_02020f00,5);
          auVar267._8_4_ = 0x7f800000;
          auVar267._0_8_ = 0x7f8000007f800000;
          auVar267._12_4_ = 0x7f800000;
          auVar267._16_4_ = 0x7f800000;
          auVar267._20_4_ = 0x7f800000;
          auVar267._24_4_ = 0x7f800000;
          auVar267._28_4_ = 0x7f800000;
          auVar249 = vblendvps_avx(auVar267,auVar49,auVar12);
          auVar70._4_4_ = uStack_8fc;
          auVar70._0_4_ = local_900;
          auVar70._8_4_ = uStack_8f8;
          auVar70._12_4_ = uStack_8f4;
          auVar70._16_4_ = uStack_8f0;
          auVar70._20_4_ = uStack_8ec;
          auVar70._24_4_ = uStack_8e8;
          auVar70._28_4_ = uStack_8e4;
          auVar11 = vandps_avx(auVar70,auVar34);
          auVar11 = vmaxps_avx(local_5c0,auVar11);
          auVar285 = ZEXT3264(CONCAT428(0x36000000,
                                        CONCAT424(0x36000000,
                                                  CONCAT420(0x36000000,
                                                            CONCAT416(0x36000000,
                                                                      CONCAT412(0x36000000,
                                                                                CONCAT48(0x36000000,
                                                                                                                                                                                  
                                                  0x3600000036000000)))))));
          auVar54._4_4_ = auVar11._4_4_ * 1.9073486e-06;
          auVar54._0_4_ = auVar11._0_4_ * 1.9073486e-06;
          auVar54._8_4_ = auVar11._8_4_ * 1.9073486e-06;
          auVar54._12_4_ = auVar11._12_4_ * 1.9073486e-06;
          auVar54._16_4_ = auVar11._16_4_ * 1.9073486e-06;
          auVar54._20_4_ = auVar11._20_4_ * 1.9073486e-06;
          auVar54._24_4_ = auVar11._24_4_ * 1.9073486e-06;
          auVar54._28_4_ = auVar11._28_4_;
          auVar11 = vandps_avx(auVar70,auVar14);
          auVar13 = vcmpps_avx(auVar11,auVar54,1);
          auVar268._8_4_ = 0xff800000;
          auVar268._0_8_ = 0xff800000ff800000;
          auVar268._12_4_ = 0xff800000;
          auVar268._16_4_ = 0xff800000;
          auVar268._20_4_ = 0xff800000;
          auVar268._24_4_ = 0xff800000;
          auVar268._28_4_ = 0xff800000;
          auVar11 = vblendvps_avx(auVar268,auVar50,auVar12);
          auVar269 = ZEXT3264(auVar11);
          auVar247 = auVar12 & auVar13;
          if ((((((((auVar247 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar247 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar247 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar247 >> 0x7f,0) != '\0') ||
                (auVar247 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar247 >> 0xbf,0) != '\0') ||
              (auVar247 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar247[0x1f] < '\0') {
            auVar229 = vandps_avx(auVar13,auVar12);
            auVar13 = vcmpps_avx(auVar121,_DAT_02020f00,2);
            auVar299._8_4_ = 0xff800000;
            auVar299._0_8_ = 0xff800000ff800000;
            auVar299._12_4_ = 0xff800000;
            auVar299._16_4_ = 0xff800000;
            auVar299._20_4_ = 0xff800000;
            auVar299._24_4_ = 0xff800000;
            auVar299._28_4_ = 0xff800000;
            auVar300 = ZEXT3264(auVar299);
            auVar305._8_4_ = 0x7f800000;
            auVar305._0_8_ = 0x7f8000007f800000;
            auVar305._12_4_ = 0x7f800000;
            auVar305._16_4_ = 0x7f800000;
            auVar305._20_4_ = 0x7f800000;
            auVar305._24_4_ = 0x7f800000;
            auVar305._28_4_ = 0x7f800000;
            auVar306 = ZEXT3264(auVar305);
            auVar121 = vblendvps_avx(auVar305,auVar299,auVar13);
            auVar110 = vpackssdw_avx(auVar229._0_16_,auVar229._16_16_);
            auVar247 = vpmovsxwd_avx2(auVar110);
            auVar249 = vblendvps_avx(auVar249,auVar121,auVar247);
            auVar121 = vblendvps_avx(auVar299,auVar305,auVar13);
            auVar285 = ZEXT3264(auVar121);
            auVar121 = vblendvps_avx(auVar11,auVar121,auVar247);
            auVar269 = ZEXT3264(auVar121);
            auVar230._0_8_ = auVar229._0_8_ ^ 0xffffffffffffffff;
            auVar230._8_4_ = auVar229._8_4_ ^ 0xffffffff;
            auVar230._12_4_ = auVar229._12_4_ ^ 0xffffffff;
            auVar230._16_4_ = auVar229._16_4_ ^ 0xffffffff;
            auVar230._20_4_ = auVar229._20_4_ ^ 0xffffffff;
            auVar230._24_4_ = auVar229._24_4_ ^ 0xffffffff;
            auVar230._28_4_ = auVar229._28_4_ ^ 0xffffffff;
            auVar229 = vorps_avx(auVar13,auVar230);
            auVar229 = vandps_avx(auVar12,auVar229);
          }
        }
        auVar315 = local_a40._0_28_;
        local_420 = _local_8c0;
        local_400 = vminps_avx(local_2a0,auVar249);
        _local_6e0 = vmaxps_avx(_local_8c0,auVar269._0_32_);
        _local_2c0 = _local_6e0;
        auVar121 = vcmpps_avx(_local_8c0,local_400,2);
        local_6a0 = vandps_avx(auVar121,auVar217);
        auVar121 = vcmpps_avx(_local_6e0,local_2a0,2);
        local_780 = vandps_avx(auVar121,auVar217);
        auVar217 = vorps_avx(local_780,local_6a0);
        if ((((((((auVar217 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar217 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar217 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar217 >> 0x7f,0) != '\0') ||
              (auVar217 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar217 >> 0xbf,0) != '\0') ||
            (auVar217 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar217[0x1f] < '\0') {
          local_720._0_8_ = auVar229._0_8_ ^ 0xffffffffffffffff;
          local_720._8_4_ = auVar229._8_4_ ^ 0xffffffff;
          local_720._12_4_ = auVar229._12_4_ ^ 0xffffffff;
          local_720._16_4_ = auVar229._16_4_ ^ 0xffffffff;
          local_720._20_4_ = auVar229._20_4_ ^ 0xffffffff;
          local_720._24_4_ = auVar229._24_4_ ^ 0xffffffff;
          local_720._28_4_ = auVar229._28_4_ ^ 0xffffffff;
          auVar190._0_4_ = (float)local_a40._0_4_ * auVar189._0_4_;
          auVar190._4_4_ = (float)local_a40._4_4_ * auVar189._4_4_;
          auVar190._8_4_ = fStack_a38 * auVar189._8_4_;
          auVar190._12_4_ = fStack_a34 * auVar189._12_4_;
          auVar190._16_4_ = fStack_a30 * auVar189._16_4_;
          auVar190._20_4_ = fStack_a2c * auVar189._20_4_;
          auVar190._28_36_ = auVar189._28_36_;
          auVar190._24_4_ = fStack_a28 * auVar189._24_4_;
          auVar110 = vfmadd132ps_fma(auVar153,auVar190._0_32_,_local_8e0);
          auVar110 = vfmadd213ps_fma(auVar125,auVar280,ZEXT1632(auVar110));
          auVar71._4_4_ = uStack_8fc;
          auVar71._0_4_ = local_900;
          auVar71._8_4_ = uStack_8f8;
          auVar71._12_4_ = uStack_8f4;
          auVar71._16_4_ = uStack_8f0;
          auVar71._20_4_ = uStack_8ec;
          auVar71._24_4_ = uStack_8e8;
          auVar71._28_4_ = uStack_8e4;
          auVar217 = vandps_avx(ZEXT1632(auVar110),auVar71);
          auVar155._8_4_ = 0x3e99999a;
          auVar155._0_8_ = 0x3e99999a3e99999a;
          auVar155._12_4_ = 0x3e99999a;
          auVar155._16_4_ = 0x3e99999a;
          auVar155._20_4_ = 0x3e99999a;
          auVar155._24_4_ = 0x3e99999a;
          auVar155._28_4_ = 0x3e99999a;
          auVar217 = vcmpps_avx(auVar217,auVar155,1);
          auVar217 = vorps_avx(auVar217,local_720);
          auVar156._8_4_ = 3;
          auVar156._0_8_ = 0x300000003;
          auVar156._12_4_ = 3;
          auVar156._16_4_ = 3;
          auVar156._20_4_ = 3;
          auVar156._24_4_ = 3;
          auVar156._28_4_ = 3;
          auVar184._8_4_ = 2;
          auVar184._0_8_ = 0x200000002;
          auVar184._12_4_ = 2;
          auVar184._16_4_ = 2;
          auVar184._20_4_ = 2;
          auVar184._24_4_ = 2;
          auVar184._28_4_ = 2;
          auVar217 = vblendvps_avx(auVar184,auVar156,auVar217);
          uVar102 = (undefined4)uVar103;
          local_740._4_4_ = uVar102;
          local_740._0_4_ = uVar102;
          local_740._8_4_ = uVar102;
          local_740._12_4_ = uVar102;
          local_740._16_4_ = uVar102;
          local_740._20_4_ = uVar102;
          local_740._24_4_ = uVar102;
          local_740._28_4_ = uVar102;
          local_6c0 = vpcmpgtd_avx2(auVar217,local_740);
          local_760 = vpandn_avx2(local_6c0,local_6a0);
          auVar189 = ZEXT3264(local_760);
          auVar217 = local_6a0 & ~local_6c0;
          auStack_798 = auVar20._8_24_;
          local_7a0 = uVar103;
          fStack_b3c = auVar7._4_4_;
          fStack_b38 = auVar7._8_4_;
          fStack_b34 = auVar7._12_4_;
          local_700 = local_780;
          if ((((((((auVar217 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar217 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar217 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar217 >> 0x7f,0) != '\0') ||
                (auVar217 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar217 >> 0xbf,0) != '\0') ||
              (auVar217 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar217[0x1f] < '\0') {
            auVar109 = vminps_avx(auVar8,auVar10);
            auVar110 = vmaxps_avx(auVar8,auVar10);
            auVar168 = vminps_avx(auVar9,auVar7);
            auVar136 = vminps_avx(auVar109,auVar168);
            auVar109 = vmaxps_avx(auVar9,auVar7);
            auVar168 = vmaxps_avx(auVar110,auVar109);
            auVar110 = vandps_avx(auVar136,auVar242);
            auVar109 = vandps_avx(auVar168,auVar242);
            auVar110 = vmaxps_avx(auVar110,auVar109);
            auVar109 = vmovshdup_avx(auVar110);
            auVar109 = vmaxss_avx(auVar109,auVar110);
            auVar110 = vshufpd_avx(auVar110,auVar110,1);
            auVar110 = vmaxss_avx(auVar110,auVar109);
            local_a20._0_4_ = auVar110._0_4_ * 1.9073486e-06;
            local_860 = vshufps_avx(auVar168,auVar168,0xff);
            local_8a0._4_4_ = (float)local_8c0._4_4_ + fVar134;
            local_8a0._0_4_ = (float)local_8c0._0_4_ + fVar134;
            fStack_898 = fStack_8b8 + fVar134;
            fStack_894 = fStack_8b4 + fVar134;
            fStack_890 = fStack_8b0 + fVar134;
            fStack_88c = fStack_8ac + fVar134;
            fStack_888 = fStack_8a8 + fVar134;
            fStack_884 = fStack_8a4 + fVar134;
            do {
              auVar157._8_4_ = 0x7f800000;
              auVar157._0_8_ = 0x7f8000007f800000;
              auVar157._12_4_ = 0x7f800000;
              auVar157._16_4_ = 0x7f800000;
              auVar157._20_4_ = 0x7f800000;
              auVar157._24_4_ = 0x7f800000;
              auVar157._28_4_ = 0x7f800000;
              auVar217 = auVar189._0_32_;
              auVar229 = vblendvps_avx(auVar157,_local_8c0,auVar217);
              auVar121 = vshufps_avx(auVar229,auVar229,0xb1);
              auVar121 = vminps_avx(auVar229,auVar121);
              auVar11 = vshufpd_avx(auVar121,auVar121,5);
              auVar121 = vminps_avx(auVar121,auVar11);
              auVar11 = vpermpd_avx2(auVar121,0x4e);
              auVar121 = vminps_avx(auVar121,auVar11);
              auVar229 = vcmpps_avx(auVar229,auVar121,0);
              auVar121 = auVar217 & auVar229;
              if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar121 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar121 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar121 >> 0x7f,0) != '\0') ||
                    (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar121 >> 0xbf,0) != '\0') ||
                  (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar121[0x1f] < '\0') {
                auVar217 = vandps_avx(auVar229,auVar217);
              }
              local_880._0_8_ = uVar104;
              uVar101 = vmovmskps_avx(auVar217);
              iVar97 = 0;
              for (; (uVar101 & 1) == 0; uVar101 = uVar101 >> 1 | 0x80000000) {
                iVar97 = iVar97 + 1;
              }
              uVar101 = iVar97 << 2;
              *(undefined4 *)(local_760 + uVar101) = 0;
              fVar273 = *(float *)(local_660 + uVar101);
              uVar101 = *(uint *)(local_420 + uVar101);
              fVar241 = auVar5._0_4_;
              if ((float)local_a00._0_4_ < 0.0) {
                fVar241 = sqrtf((float)local_a00._0_4_);
              }
              auVar285 = ZEXT464(uVar101);
              local_800._0_4_ = fVar241 * 1.9073486e-06;
              lVar100 = 5;
              do {
                fVar241 = auVar285._0_4_;
                auVar111._4_4_ = fVar241;
                auVar111._0_4_ = fVar241;
                auVar111._8_4_ = fVar241;
                auVar111._12_4_ = fVar241;
                auVar109 = vfmadd213ps_fma(auVar111,local_9f0,_DAT_01feba10);
                fVar253 = 1.0 - fVar273;
                auVar116 = SUB6416(ZEXT464(0x40400000),0);
                auVar108 = SUB6416(ZEXT464(0xc0a00000),0);
                auVar145 = ZEXT416((uint)fVar273);
                auVar168 = vfmadd213ss_fma(auVar116,auVar145,auVar108);
                auVar110 = vfmadd213ss_fma(auVar168,ZEXT416((uint)(fVar273 * fVar273)),
                                           SUB6416(ZEXT464(0x40000000),0));
                auVar136 = vfmadd213ss_fma(auVar116,ZEXT416((uint)fVar253),auVar108);
                auVar136 = vfmadd213ss_fma(auVar136,ZEXT416((uint)(fVar253 * fVar253)),
                                           SUB6416(ZEXT464(0x40000000),0));
                fVar106 = fVar253 * fVar253 * -fVar273 * 0.5;
                fVar250 = auVar110._0_4_ * 0.5;
                fVar251 = auVar136._0_4_ * 0.5;
                fVar252 = fVar273 * fVar273 * -fVar253 * 0.5;
                auVar192._0_4_ = fVar252 * fVar191;
                auVar192._4_4_ = fVar252 * fStack_b3c;
                auVar192._8_4_ = fVar252 * fStack_b38;
                auVar192._12_4_ = fVar252 * fStack_b34;
                auVar213._4_4_ = fVar251;
                auVar213._0_4_ = fVar251;
                auVar213._8_4_ = fVar251;
                auVar213._12_4_ = fVar251;
                auVar110 = vfmadd132ps_fma(auVar213,auVar192,auVar9);
                auVar169._4_4_ = fVar250;
                auVar169._0_4_ = fVar250;
                auVar169._8_4_ = fVar250;
                auVar169._12_4_ = fVar250;
                auVar110 = vfmadd132ps_fma(auVar169,auVar110,auVar10);
                auVar193._4_4_ = fVar106;
                auVar193._0_4_ = fVar106;
                auVar193._8_4_ = fVar106;
                auVar193._12_4_ = fVar106;
                auVar110 = vfmadd132ps_fma(auVar193,auVar110,auVar8);
                auVar108 = vfmadd231ss_fma(auVar108,auVar145,ZEXT416(0x41100000));
                auVar136 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar145,
                                           ZEXT416(0x40800000));
                local_7c0._0_16_ = auVar110;
                auVar110 = vsubps_avx(auVar109,auVar110);
                _local_9e0 = auVar110;
                auVar110 = vdpps_avx(auVar110,auVar110,0x7f);
                auVar109 = vfmadd213ss_fma(auVar116,auVar145,ZEXT416(0xbf800000));
                fVar106 = auVar110._0_4_;
                if (fVar106 < 0.0) {
                  local_a60._0_4_ = fVar253 * -2.0;
                  auVar269._0_4_ = sqrtf(fVar106);
                  auVar269._4_60_ = extraout_var;
                  auVar168 = ZEXT416(auVar168._0_4_);
                  auVar116 = auVar269._0_16_;
                  fVar250 = (float)local_a60._0_4_;
                }
                else {
                  auVar116 = vsqrtss_avx(auVar110,auVar110);
                  fVar250 = fVar253 * -2.0;
                }
                auVar168 = vfmadd213ss_fma(auVar168,ZEXT416((uint)(fVar273 + fVar273)),
                                           ZEXT416((uint)(fVar273 * fVar273 * 3.0)));
                auVar211 = SUB6416(ZEXT464(0x40000000),0);
                auVar212 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar145,auVar211);
                auVar107 = vfmadd231ss_fma(ZEXT416((uint)(fVar253 * fVar253 * -3.0)),
                                           ZEXT416((uint)(fVar253 + fVar253)),auVar212);
                auVar135 = vfnmadd231ss_fma(ZEXT416((uint)(fVar273 * (fVar253 + fVar253))),
                                            ZEXT416((uint)fVar253),ZEXT416((uint)fVar253));
                auVar212 = vfmadd213ss_fma(ZEXT416((uint)fVar250),auVar145,
                                           ZEXT416((uint)(fVar273 * fVar273)));
                fVar250 = auVar135._0_4_ * 0.5;
                fVar251 = auVar168._0_4_ * 0.5;
                fVar252 = auVar107._0_4_ * 0.5;
                fVar253 = auVar212._0_4_ * 0.5;
                auVar194._0_4_ = fVar191 * fVar253;
                auVar194._4_4_ = fStack_b3c * fVar253;
                auVar194._8_4_ = fStack_b38 * fVar253;
                auVar194._12_4_ = fStack_b34 * fVar253;
                auVar170._4_4_ = fVar252;
                auVar170._0_4_ = fVar252;
                auVar170._8_4_ = fVar252;
                auVar170._12_4_ = fVar252;
                auVar168 = vfmadd213ps_fma(auVar170,auVar9,auVar194);
                auVar137._4_4_ = fVar251;
                auVar137._0_4_ = fVar251;
                auVar137._8_4_ = fVar251;
                auVar137._12_4_ = fVar251;
                auVar168 = vfmadd213ps_fma(auVar137,auVar10,auVar168);
                auVar292._4_4_ = fVar250;
                auVar292._0_4_ = fVar250;
                auVar292._8_4_ = fVar250;
                auVar292._12_4_ = fVar250;
                auVar212 = vfmadd213ps_fma(auVar292,auVar8,auVar168);
                auVar145 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),auVar145,auVar211);
                local_b80 = auVar109._0_4_;
                auVar112._0_4_ = fVar191 * local_b80;
                auVar112._4_4_ = fStack_b3c * local_b80;
                auVar112._8_4_ = fStack_b38 * local_b80;
                auVar112._12_4_ = fStack_b34 * local_b80;
                local_ac0 = auVar136._0_4_;
                auVar171._4_4_ = local_ac0;
                auVar171._0_4_ = local_ac0;
                auVar171._8_4_ = local_ac0;
                auVar171._12_4_ = local_ac0;
                auVar109 = vfmadd213ps_fma(auVar171,auVar9,auVar112);
                uVar102 = auVar108._0_4_;
                auVar195._4_4_ = uVar102;
                auVar195._0_4_ = uVar102;
                auVar195._8_4_ = uVar102;
                auVar195._12_4_ = uVar102;
                auVar109 = vfmadd213ps_fma(auVar195,auVar10,auVar109);
                auVar168 = vdpps_avx(auVar212,auVar212,0x7f);
                auVar138._0_4_ = auVar145._0_4_;
                auVar138._4_4_ = auVar138._0_4_;
                auVar138._8_4_ = auVar138._0_4_;
                auVar138._12_4_ = auVar138._0_4_;
                auVar108 = vfmadd213ps_fma(auVar138,auVar8,auVar109);
                auVar109 = vblendps_avx(auVar168,_DAT_01feba10,0xe);
                auVar136 = vrsqrtss_avx(auVar109,auVar109);
                fVar252 = auVar168._0_4_;
                fVar250 = auVar136._0_4_;
                auVar136 = vdpps_avx(auVar212,auVar108,0x7f);
                fVar250 = fVar250 * 1.5 + fVar252 * -0.5 * fVar250 * fVar250 * fVar250;
                auVar139._0_4_ = auVar108._0_4_ * fVar252;
                auVar139._4_4_ = auVar108._4_4_ * fVar252;
                auVar139._8_4_ = auVar108._8_4_ * fVar252;
                auVar139._12_4_ = auVar108._12_4_ * fVar252;
                fVar251 = auVar136._0_4_;
                auVar227._0_4_ = auVar212._0_4_ * fVar251;
                auVar227._4_4_ = auVar212._4_4_ * fVar251;
                fVar253 = auVar212._8_4_;
                auVar227._8_4_ = fVar253 * fVar251;
                fVar254 = auVar212._12_4_;
                auVar227._12_4_ = fVar254 * fVar251;
                auVar136 = vsubps_avx(auVar139,auVar227);
                auVar109 = vrcpss_avx(auVar109,auVar109);
                auVar108 = vfnmadd213ss_fma(auVar109,auVar168,auVar211);
                fVar251 = auVar109._0_4_ * auVar108._0_4_;
                auVar109 = vmaxss_avx(ZEXT416((uint)local_a20._0_4_),
                                      ZEXT416((uint)(fVar241 * (float)local_800._0_4_)));
                auVar285 = ZEXT1664(auVar109);
                auVar260._0_8_ = auVar212._0_8_ ^ 0x8000000080000000;
                auVar260._8_4_ = -fVar253;
                auVar260._12_4_ = -fVar254;
                auVar196._0_4_ = fVar250 * auVar136._0_4_ * fVar251;
                auVar196._4_4_ = fVar250 * auVar136._4_4_ * fVar251;
                auVar196._8_4_ = fVar250 * auVar136._8_4_ * fVar251;
                auVar196._12_4_ = fVar250 * auVar136._12_4_ * fVar251;
                auVar244._0_4_ = auVar212._0_4_ * fVar250;
                auVar244._4_4_ = auVar212._4_4_ * fVar250;
                auVar244._8_4_ = fVar253 * fVar250;
                auVar244._12_4_ = fVar254 * fVar250;
                if (fVar252 < -fVar252) {
                  fVar250 = sqrtf(fVar252);
                  auVar285 = ZEXT464(auVar109._0_4_);
                  auVar116 = ZEXT416(auVar116._0_4_);
                }
                else {
                  auVar168 = vsqrtss_avx(auVar168,auVar168);
                  fVar250 = auVar168._0_4_;
                }
                auVar168 = vdpps_avx(_local_9e0,auVar244,0x7f);
                auVar107 = vfmadd213ss_fma(ZEXT416((uint)local_a20._0_4_),auVar116,auVar285._0_16_);
                auVar136 = vdpps_avx(auVar260,auVar244,0x7f);
                auVar108 = vdpps_avx(_local_9e0,auVar196,0x7f);
                auVar145 = vdpps_avx(local_9f0,auVar244,0x7f);
                auVar107 = vfmadd213ss_fma(ZEXT416((uint)(auVar116._0_4_ + 1.0)),
                                           ZEXT416((uint)((float)local_a20._0_4_ / fVar250)),
                                           auVar107);
                auVar306 = ZEXT1664(auVar107);
                fVar250 = auVar136._0_4_ + auVar108._0_4_;
                auVar113._0_4_ = auVar168._0_4_ * auVar168._0_4_;
                auVar113._4_4_ = auVar168._4_4_ * auVar168._4_4_;
                auVar113._8_4_ = auVar168._8_4_ * auVar168._8_4_;
                auVar113._12_4_ = auVar168._12_4_ * auVar168._12_4_;
                auVar136 = vdpps_avx(_local_9e0,auVar260,0x7f);
                auVar116 = vsubps_avx(auVar110,auVar113);
                auVar108 = vrsqrtss_avx(auVar116,auVar116);
                fVar252 = auVar116._0_4_;
                fVar251 = auVar108._0_4_;
                fVar251 = fVar251 * 1.5 + fVar252 * -0.5 * fVar251 * fVar251 * fVar251;
                auVar108 = vdpps_avx(_local_9e0,local_9f0,0x7f);
                auVar136 = vfnmadd231ss_fma(auVar136,auVar168,ZEXT416((uint)fVar250));
                auVar108 = vfnmadd231ss_fma(auVar108,auVar168,auVar145);
                if (fVar252 < 0.0) {
                  local_a60._0_16_ = ZEXT416((uint)fVar250);
                  local_820._0_4_ = fVar251;
                  local_840._0_16_ = auVar108;
                  fVar252 = sqrtf(fVar252);
                  auVar306 = ZEXT464(auVar107._0_4_);
                  auVar285 = ZEXT464(auVar109._0_4_);
                  fVar251 = (float)local_820._0_4_;
                  auVar108 = local_840._0_16_;
                  auVar109 = local_a60._0_16_;
                }
                else {
                  auVar109 = vsqrtss_avx(auVar116,auVar116);
                  fVar252 = auVar109._0_4_;
                  auVar109 = ZEXT416((uint)fVar250);
                }
                auVar300 = ZEXT1664(auVar168);
                auVar269 = ZEXT3264(_local_a40);
                auVar107 = vpermilps_avx(local_7c0._0_16_,0xff);
                auVar116 = vshufps_avx(auVar212,auVar212,0xff);
                auVar136 = vfmsub213ss_fma(auVar136,ZEXT416((uint)fVar251),auVar116);
                auVar197._0_8_ = auVar145._0_8_ ^ 0x8000000080000000;
                auVar197._8_4_ = auVar145._8_4_ ^ 0x80000000;
                auVar197._12_4_ = auVar145._12_4_ ^ 0x80000000;
                auVar214._0_8_ = auVar136._0_8_ ^ 0x8000000080000000;
                auVar214._8_4_ = auVar136._8_4_ ^ 0x80000000;
                auVar214._12_4_ = auVar136._12_4_ ^ 0x80000000;
                auVar135 = ZEXT416((uint)(auVar108._0_4_ * fVar251));
                auVar108 = vfmsub231ss_fma(ZEXT416((uint)(auVar136._0_4_ * auVar145._0_4_)),auVar109
                                           ,auVar135);
                auVar136 = vinsertps_avx(auVar135,auVar197,0x10);
                uVar102 = auVar108._0_4_;
                auVar198._4_4_ = uVar102;
                auVar198._0_4_ = uVar102;
                auVar198._8_4_ = uVar102;
                auVar198._12_4_ = uVar102;
                auVar136 = vdivps_avx(auVar136,auVar198);
                auVar145 = ZEXT416((uint)(fVar252 - auVar107._0_4_));
                auVar108 = vinsertps_avx(auVar168,auVar145,0x10);
                auVar172._0_4_ = auVar108._0_4_ * auVar136._0_4_;
                auVar172._4_4_ = auVar108._4_4_ * auVar136._4_4_;
                auVar172._8_4_ = auVar108._8_4_ * auVar136._8_4_;
                auVar172._12_4_ = auVar108._12_4_ * auVar136._12_4_;
                auVar109 = vinsertps_avx(auVar214,auVar109,0x1c);
                auVar109 = vdivps_avx(auVar109,auVar198);
                auVar136 = vhaddps_avx(auVar172,auVar172);
                auVar199._0_4_ = auVar108._0_4_ * auVar109._0_4_;
                auVar199._4_4_ = auVar108._4_4_ * auVar109._4_4_;
                auVar199._8_4_ = auVar108._8_4_ * auVar109._8_4_;
                auVar199._12_4_ = auVar108._12_4_ * auVar109._12_4_;
                auVar109 = vhaddps_avx(auVar199,auVar199);
                fVar273 = fVar273 - auVar136._0_4_;
                fVar241 = fVar241 - auVar109._0_4_;
                auVar109 = vandps_avx(auVar168,auVar242);
                bVar55 = true;
                auVar315 = local_a40._0_28_;
                if (auVar306._0_4_ <= auVar109._0_4_) {
LAB_016c1bf1:
                  auVar285 = ZEXT464((uint)fVar241);
                }
                else {
                  auVar136 = vfmadd231ss_fma(ZEXT416((uint)(auVar285._0_4_ + auVar306._0_4_)),
                                             local_860,ZEXT416(0x36000000));
                  auVar109 = vandps_avx(auVar145,auVar242);
                  if (auVar136._0_4_ <= auVar109._0_4_) goto LAB_016c1bf1;
                  fVar241 = fVar241 + (float)local_990._0_4_;
                  if (fVar241 < fVar133) {
                    bVar55 = false;
                    unaff_BL = 0;
                    goto LAB_016c1bf1;
                  }
                  fVar250 = *(float *)(ray + k * 4 + 0x100);
                  auVar109 = ZEXT416((uint)fVar241);
                  bVar55 = false;
                  if (fVar241 <= fVar250) {
                    auVar285 = ZEXT1664(auVar109);
                    if ((fVar273 < 0.0) || (1.0 < fVar273)) {
                      unaff_BL = 0;
                    }
                    else {
                      auVar110 = vrsqrtss_avx(auVar110,auVar110);
                      fVar251 = auVar110._0_4_;
                      pGVar3 = (context->scene->geometries).items[uVar96].ptr;
                      if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                        unaff_BL = 0;
                      }
                      else {
                        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                           (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                          fVar106 = fVar251 * 1.5 + fVar106 * -0.5 * fVar251 * fVar251 * fVar251;
                          auVar140._0_4_ = fVar106 * (float)local_9e0._0_4_;
                          auVar140._4_4_ = fVar106 * (float)local_9e0._4_4_;
                          auVar140._8_4_ = fVar106 * fStack_9d8;
                          auVar140._12_4_ = fVar106 * fStack_9d4;
                          auVar116 = vfmadd213ps_fma(auVar116,auVar140,auVar212);
                          auVar110 = vshufps_avx(auVar140,auVar140,0xc9);
                          auVar136 = vshufps_avx(auVar212,auVar212,0xc9);
                          auVar141._0_4_ = auVar140._0_4_ * auVar136._0_4_;
                          auVar141._4_4_ = auVar140._4_4_ * auVar136._4_4_;
                          auVar141._8_4_ = auVar140._8_4_ * auVar136._8_4_;
                          auVar141._12_4_ = auVar140._12_4_ * auVar136._12_4_;
                          auVar108 = vfmsub231ps_fma(auVar141,auVar212,auVar110);
                          auVar110 = vshufps_avx(auVar108,auVar108,0xc9);
                          auVar136 = vshufps_avx(auVar116,auVar116,0xc9);
                          auVar108 = vshufps_avx(auVar108,auVar108,0xd2);
                          auVar114._0_4_ = auVar116._0_4_ * auVar108._0_4_;
                          auVar114._4_4_ = auVar116._4_4_ * auVar108._4_4_;
                          auVar114._8_4_ = auVar116._8_4_ * auVar108._8_4_;
                          auVar114._12_4_ = auVar116._12_4_ * auVar108._12_4_;
                          auVar136 = vfmsub231ps_fma(auVar114,auVar110,auVar136);
                          auVar158._4_4_ = fVar273;
                          auVar158._0_4_ = fVar273;
                          auVar158._8_4_ = fVar273;
                          auVar158._12_4_ = fVar273;
                          auVar158._16_4_ = fVar273;
                          auVar158._20_4_ = fVar273;
                          auVar158._24_4_ = fVar273;
                          auVar158._28_4_ = fVar273;
                          auVar110 = vmovshdup_avx(auVar136);
                          local_3e0._8_8_ = auVar110._0_8_;
                          auVar110 = vshufps_avx(auVar136,auVar136,0xaa);
                          local_3c0 = auVar110._0_8_;
                          local_3a0 = auVar136._0_4_;
                          local_3e0._0_8_ = local_3e0._8_8_;
                          local_3e0._16_8_ = local_3e0._8_8_;
                          local_3e0._24_8_ = local_3e0._8_8_;
                          uStack_3b8 = local_3c0;
                          uStack_3b0 = local_3c0;
                          uStack_3a8 = local_3c0;
                          uStack_39c = local_3a0;
                          uStack_398 = local_3a0;
                          uStack_394 = local_3a0;
                          uStack_390 = local_3a0;
                          uStack_38c = local_3a0;
                          uStack_388 = local_3a0;
                          uStack_384 = local_3a0;
                          local_380 = auVar158;
                          local_360 = ZEXT432(0) << 0x20;
                          local_340 = CONCAT44(uStack_5fc,local_600);
                          uStack_338 = CONCAT44(uStack_5f4,uStack_5f8);
                          uStack_330 = CONCAT44(uStack_5ec,uStack_5f0);
                          uStack_328 = CONCAT44(uStack_5e4,uStack_5e8);
                          local_320._4_4_ = uStack_5dc;
                          local_320._0_4_ = local_5e0;
                          local_320._8_4_ = uStack_5d8;
                          local_320._12_4_ = uStack_5d4;
                          local_320._16_4_ = uStack_5d0;
                          local_320._20_4_ = uStack_5cc;
                          local_320._24_4_ = uStack_5c8;
                          local_320._28_4_ = uStack_5c4;
                          vpcmpeqd_avx2(local_320,local_320);
                          local_300 = context->user->instID[0];
                          uStack_2fc = local_300;
                          uStack_2f8 = local_300;
                          uStack_2f4 = local_300;
                          uStack_2f0 = local_300;
                          uStack_2ec = local_300;
                          uStack_2e8 = local_300;
                          uStack_2e4 = local_300;
                          local_2e0 = context->user->instPrimID[0];
                          uStack_2dc = local_2e0;
                          uStack_2d8 = local_2e0;
                          uStack_2d4 = local_2e0;
                          uStack_2d0 = local_2e0;
                          uStack_2cc = local_2e0;
                          uStack_2c8 = local_2e0;
                          uStack_2c4 = local_2e0;
                          *(float *)(ray + k * 4 + 0x100) = fVar241;
                          local_9c0 = local_620._0_8_;
                          uStack_9b8 = local_620._8_8_;
                          uStack_9b0 = local_620._16_8_;
                          uStack_9a8 = local_620._24_8_;
                          local_a90.valid = (int *)&local_9c0;
                          local_a90.geometryUserPtr = pGVar3->userPtr;
                          local_a90.context = context->user;
                          local_a90.hit = (RTCHitN *)local_3e0;
                          local_a90.N = 8;
                          local_a90.ray = (RTCRayN *)ray;
                          if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                            auVar269 = ZEXT1664(local_a40._0_16_);
                            auVar300 = ZEXT1664(auVar168);
                            auVar306 = ZEXT1664(auVar306._0_16_);
                            (*pGVar3->occlusionFilterN)(&local_a90);
                            auVar166._8_56_ = extraout_var_02;
                            auVar166._0_8_ = extraout_XMM1_Qa;
                            auVar158 = auVar166._0_32_;
                          }
                          auVar315 = local_a40._0_28_;
                          auVar64._8_8_ = uStack_9b8;
                          auVar64._0_8_ = local_9c0;
                          auVar64._16_8_ = uStack_9b0;
                          auVar64._24_8_ = uStack_9a8;
                          auVar229 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),
                                                   auVar64);
                          auVar121 = vpcmpeqd_avx2(auVar158,auVar158);
                          auVar217 = auVar121 & ~auVar229;
                          if ((((((((auVar217 >> 0x1f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0 &&
                                   (auVar217 >> 0x3f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar217 >> 0x5f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) && SUB321(auVar217 >> 0x7f,0) == '\0') &&
                                (auVar217 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                               && SUB321(auVar217 >> 0xbf,0) == '\0') &&
                              (auVar217 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                              && -1 < auVar217[0x1f]) {
                            auVar229 = auVar229 ^ auVar121;
                          }
                          else {
                            p_Var4 = context->args->filter;
                            if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                              auVar269 = ZEXT1664(auVar269._0_16_);
                              auVar300 = ZEXT1664(auVar300._0_16_);
                              auVar306 = ZEXT1664(auVar306._0_16_);
                              (*p_Var4)(&local_a90);
                              auVar315 = local_a40._0_28_;
                            }
                            auVar65._8_8_ = uStack_9b8;
                            auVar65._0_8_ = local_9c0;
                            auVar65._16_8_ = uStack_9b0;
                            auVar65._24_8_ = uStack_9a8;
                            auVar217 = vpcmpeqd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),
                                                     auVar65);
                            auVar229 = auVar217 ^ _DAT_0205a980;
                            auVar185._8_4_ = 0xff800000;
                            auVar185._0_8_ = 0xff800000ff800000;
                            auVar185._12_4_ = 0xff800000;
                            auVar185._16_4_ = 0xff800000;
                            auVar185._20_4_ = 0xff800000;
                            auVar185._24_4_ = 0xff800000;
                            auVar185._28_4_ = 0xff800000;
                            auVar217 = vblendvps_avx(auVar185,*(undefined1 (*) [32])
                                                               (local_a90.ray + 0x100),auVar217);
                            *(undefined1 (*) [32])(local_a90.ray + 0x100) = auVar217;
                          }
                          auVar285 = ZEXT1664(auVar109);
                          bVar62 = (auVar229 >> 0x1f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0;
                          bVar63 = (auVar229 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0;
                          bVar61 = (auVar229 >> 0x5f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0;
                          bVar60 = SUB321(auVar229 >> 0x7f,0) != '\0';
                          bVar59 = (auVar229 & (undefined1  [32])0x100000000) !=
                                   (undefined1  [32])0x0;
                          bVar58 = SUB321(auVar229 >> 0xbf,0) != '\0';
                          bVar56 = (auVar229 & (undefined1  [32])0x100000000) !=
                                   (undefined1  [32])0x0;
                          bVar55 = auVar229[0x1f] < '\0';
                          unaff_BL = ((((((bVar62 || bVar63) || bVar61) || bVar60) || bVar59) ||
                                      bVar58) || bVar56) || bVar55;
                          if (((((((!bVar62 && !bVar63) && !bVar61) && !bVar60) && !bVar59) &&
                               !bVar58) && !bVar56) && !bVar55) {
                            *(float *)(ray + k * 4 + 0x100) = fVar250;
                          }
                          bVar55 = false;
                          goto LAB_016c1bf5;
                        }
                        unaff_BL = 1;
                      }
                      bVar55 = false;
                    }
                  }
                  else {
                    unaff_BL = 0;
                    auVar285 = ZEXT1664(auVar109);
                  }
                }
LAB_016c1bf5:
                if (!bVar55) goto LAB_016c1f8b;
                lVar100 = lVar100 + -1;
              } while (lVar100 != 0);
              unaff_BL = 0;
LAB_016c1f8b:
              unaff_BL = unaff_BL & 1;
              uVar104 = CONCAT71(local_880._1_7_,local_880[0] | unaff_BL);
              uVar102 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar128._4_4_ = uVar102;
              auVar128._0_4_ = uVar102;
              auVar128._8_4_ = uVar102;
              auVar128._12_4_ = uVar102;
              auVar128._16_4_ = uVar102;
              auVar128._20_4_ = uVar102;
              auVar128._24_4_ = uVar102;
              auVar128._28_4_ = uVar102;
              auVar229 = vcmpps_avx(_local_8a0,auVar128,2);
              auVar217 = vandps_avx(auVar229,local_760);
              auVar189 = ZEXT3264(auVar217);
              auVar229 = local_760 & auVar229;
              uVar103 = local_7a0;
              local_760 = auVar217;
            } while ((((((((auVar229 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar229 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar229 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar229 >> 0x7f,0) != '\0') ||
                       (auVar229 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar229 >> 0xbf,0) != '\0') ||
                     (auVar229 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar229[0x1f] < '\0');
          }
          auVar131._0_4_ = auVar315._0_4_ * (float)local_960._0_4_;
          auVar131._4_4_ = auVar315._4_4_ * (float)local_960._4_4_;
          auVar131._8_4_ = auVar315._8_4_ * fStack_958;
          auVar131._12_4_ = auVar315._12_4_ * fStack_954;
          auVar131._16_4_ = auVar315._16_4_ * fStack_950;
          auVar131._20_4_ = auVar315._20_4_ * fStack_94c;
          auVar131._28_36_ = auVar189._28_36_;
          auVar131._24_4_ = auVar315._24_4_ * fStack_948;
          auVar110 = vfmadd132ps_fma(local_940,auVar131._0_32_,_local_8e0);
          auVar110 = vfmadd213ps_fma(_local_920,auVar280,ZEXT1632(auVar110));
          auVar72._4_4_ = uStack_8fc;
          auVar72._0_4_ = local_900;
          auVar72._8_4_ = uStack_8f8;
          auVar72._12_4_ = uStack_8f4;
          auVar72._16_4_ = uStack_8f0;
          auVar72._20_4_ = uStack_8ec;
          auVar72._24_4_ = uStack_8e8;
          auVar72._28_4_ = uStack_8e4;
          auVar217 = vandps_avx(ZEXT1632(auVar110),auVar72);
          auVar159._8_4_ = 0x3e99999a;
          auVar159._0_8_ = 0x3e99999a3e99999a;
          auVar159._12_4_ = 0x3e99999a;
          auVar159._16_4_ = 0x3e99999a;
          auVar159._20_4_ = 0x3e99999a;
          auVar159._24_4_ = 0x3e99999a;
          auVar159._28_4_ = 0x3e99999a;
          auVar217 = vcmpps_avx(auVar217,auVar159,1);
          auVar229 = vorps_avx(auVar217,local_720);
          auVar160._0_4_ = fVar134 + (float)local_6e0._0_4_;
          auVar160._4_4_ = fVar134 + (float)local_6e0._4_4_;
          auVar160._8_4_ = fVar134 + fStack_6d8;
          auVar160._12_4_ = fVar134 + fStack_6d4;
          auVar160._16_4_ = fVar134 + fStack_6d0;
          auVar160._20_4_ = fVar134 + fStack_6cc;
          auVar160._24_4_ = fVar134 + fStack_6c8;
          auVar160._28_4_ = fVar134 + fStack_6c4;
          uVar102 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar186._4_4_ = uVar102;
          auVar186._0_4_ = uVar102;
          auVar186._8_4_ = uVar102;
          auVar186._12_4_ = uVar102;
          auVar186._16_4_ = uVar102;
          auVar186._20_4_ = uVar102;
          auVar186._24_4_ = uVar102;
          auVar186._28_4_ = uVar102;
          auVar217 = vcmpps_avx(auVar160,auVar186,2);
          local_940 = vandps_avx(auVar217,local_700);
          auVar161._8_4_ = 3;
          auVar161._0_8_ = 0x300000003;
          auVar161._12_4_ = 3;
          auVar161._16_4_ = 3;
          auVar161._20_4_ = 3;
          auVar161._24_4_ = 3;
          auVar161._28_4_ = 3;
          auVar187._8_4_ = 2;
          auVar187._0_8_ = 0x200000002;
          auVar187._12_4_ = 2;
          auVar187._16_4_ = 2;
          auVar187._20_4_ = 2;
          auVar187._24_4_ = 2;
          auVar187._28_4_ = 2;
          auVar217 = vblendvps_avx(auVar187,auVar161,auVar229);
          _local_960 = vpcmpgtd_avx2(auVar217,local_740);
          auVar217 = vpandn_avx2(_local_960,local_940);
          auVar229 = local_940 & ~_local_960;
          if ((((((((auVar229 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar229 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar229 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar229 >> 0x7f,0) != '\0') ||
                (auVar229 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar229 >> 0xbf,0) != '\0') ||
              (auVar229 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar229[0x1f] < '\0') {
            auVar109 = vminps_avx(auVar8,auVar10);
            auVar110 = vmaxps_avx(auVar8,auVar10);
            auVar168 = vminps_avx(auVar9,auVar7);
            auVar136 = vminps_avx(auVar109,auVar168);
            auVar109 = vmaxps_avx(auVar9,auVar7);
            auVar168 = vmaxps_avx(auVar110,auVar109);
            auVar110 = vandps_avx(auVar136,auVar242);
            auVar109 = vandps_avx(auVar168,auVar242);
            auVar110 = vmaxps_avx(auVar110,auVar109);
            auVar109 = vmovshdup_avx(auVar110);
            auVar109 = vmaxss_avx(auVar109,auVar110);
            auVar110 = vshufpd_avx(auVar110,auVar110,1);
            auVar110 = vmaxss_avx(auVar110,auVar109);
            local_a20._0_4_ = auVar110._0_4_ * 1.9073486e-06;
            local_860 = vshufps_avx(auVar168,auVar168,0xff);
            _local_8a0 = _local_2c0;
            local_920._4_4_ = (float)local_2c0._4_4_ + fVar134;
            local_920._0_4_ = (float)local_2c0._0_4_ + fVar134;
            fStack_918 = fStack_2b8 + fVar134;
            fStack_914 = fStack_2b4 + fVar134;
            fStack_910 = fStack_2b0 + fVar134;
            fStack_90c = fStack_2ac + fVar134;
            fStack_908 = fStack_2a8 + fVar134;
            fStack_904 = fStack_2a4 + fVar134;
            do {
              auVar162._8_4_ = 0x7f800000;
              auVar162._0_8_ = 0x7f8000007f800000;
              auVar162._12_4_ = 0x7f800000;
              auVar162._16_4_ = 0x7f800000;
              auVar162._20_4_ = 0x7f800000;
              auVar162._24_4_ = 0x7f800000;
              auVar162._28_4_ = 0x7f800000;
              auVar229 = vblendvps_avx(auVar162,_local_8a0,auVar217);
              auVar121 = vshufps_avx(auVar229,auVar229,0xb1);
              auVar121 = vminps_avx(auVar229,auVar121);
              auVar11 = vshufpd_avx(auVar121,auVar121,5);
              auVar121 = vminps_avx(auVar121,auVar11);
              auVar11 = vpermpd_avx2(auVar121,0x4e);
              auVar121 = vminps_avx(auVar121,auVar11);
              auVar121 = vcmpps_avx(auVar229,auVar121,0);
              auVar11 = auVar217 & auVar121;
              auVar229 = auVar217;
              if ((((((((auVar11 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar11 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar11 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar11 >> 0x7f,0) != '\0') ||
                    (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar11 >> 0xbf,0) != '\0') ||
                  (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar11[0x1f] < '\0') {
                auVar229 = vandps_avx(auVar121,auVar217);
              }
              local_880._0_8_ = uVar104;
              uVar101 = vmovmskps_avx(auVar229);
              iVar97 = 0;
              for (; (uVar101 & 1) == 0; uVar101 = uVar101 >> 1 | 0x80000000) {
                iVar97 = iVar97 + 1;
              }
              uVar101 = iVar97 << 2;
              local_780 = auVar217;
              *(undefined4 *)(local_780 + uVar101) = 0;
              fVar273 = *(float *)(local_680 + uVar101);
              uVar101 = *(uint *)(local_2a0 + uVar101);
              fVar241 = auVar6._0_4_;
              if ((float)local_a00._0_4_ < 0.0) {
                fVar241 = sqrtf((float)local_a00._0_4_);
              }
              auVar285 = ZEXT464(uVar101);
              local_800._0_4_ = fVar241 * 1.9073486e-06;
              lVar100 = 5;
              do {
                fVar241 = auVar285._0_4_;
                auVar115._4_4_ = fVar241;
                auVar115._0_4_ = fVar241;
                auVar115._8_4_ = fVar241;
                auVar115._12_4_ = fVar241;
                auVar109 = vfmadd213ps_fma(auVar115,local_9f0,_DAT_01feba10);
                fVar253 = 1.0 - fVar273;
                auVar116 = SUB6416(ZEXT464(0x40400000),0);
                auVar108 = SUB6416(ZEXT464(0xc0a00000),0);
                auVar145 = ZEXT416((uint)fVar273);
                auVar168 = vfmadd213ss_fma(auVar116,auVar145,auVar108);
                auVar110 = vfmadd213ss_fma(auVar168,ZEXT416((uint)(fVar273 * fVar273)),
                                           SUB6416(ZEXT464(0x40000000),0));
                auVar136 = vfmadd213ss_fma(auVar116,ZEXT416((uint)fVar253),auVar108);
                auVar136 = vfmadd213ss_fma(auVar136,ZEXT416((uint)(fVar253 * fVar253)),
                                           SUB6416(ZEXT464(0x40000000),0));
                fVar106 = fVar253 * fVar253 * -fVar273 * 0.5;
                fVar250 = auVar110._0_4_ * 0.5;
                fVar251 = auVar136._0_4_ * 0.5;
                fVar252 = fVar273 * fVar273 * -fVar253 * 0.5;
                auVar200._0_4_ = fVar252 * fVar191;
                auVar200._4_4_ = fVar252 * fStack_b3c;
                auVar200._8_4_ = fVar252 * fStack_b38;
                auVar200._12_4_ = fVar252 * fStack_b34;
                auVar215._4_4_ = fVar251;
                auVar215._0_4_ = fVar251;
                auVar215._8_4_ = fVar251;
                auVar215._12_4_ = fVar251;
                auVar110 = vfmadd132ps_fma(auVar215,auVar200,auVar9);
                auVar173._4_4_ = fVar250;
                auVar173._0_4_ = fVar250;
                auVar173._8_4_ = fVar250;
                auVar173._12_4_ = fVar250;
                auVar110 = vfmadd132ps_fma(auVar173,auVar110,auVar10);
                auVar201._4_4_ = fVar106;
                auVar201._0_4_ = fVar106;
                auVar201._8_4_ = fVar106;
                auVar201._12_4_ = fVar106;
                auVar110 = vfmadd132ps_fma(auVar201,auVar110,auVar8);
                auVar108 = vfmadd231ss_fma(auVar108,auVar145,ZEXT416(0x41100000));
                auVar136 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar145,
                                           ZEXT416(0x40800000));
                local_7c0._0_16_ = auVar110;
                auVar110 = vsubps_avx(auVar109,auVar110);
                _local_9e0 = auVar110;
                auVar110 = vdpps_avx(auVar110,auVar110,0x7f);
                auVar109 = vfmadd213ss_fma(auVar116,auVar145,ZEXT416(0xbf800000));
                fVar106 = auVar110._0_4_;
                if (fVar106 < 0.0) {
                  local_a60._0_4_ = fVar253 * -2.0;
                  auVar300._0_4_ = sqrtf(fVar106);
                  auVar300._4_60_ = extraout_var_00;
                  auVar168 = ZEXT416(auVar168._0_4_);
                  auVar116 = auVar300._0_16_;
                  fVar250 = (float)local_a60._0_4_;
                }
                else {
                  auVar116 = vsqrtss_avx(auVar110,auVar110);
                  fVar250 = fVar253 * -2.0;
                }
                auVar168 = vfmadd213ss_fma(auVar168,ZEXT416((uint)(fVar273 + fVar273)),
                                           ZEXT416((uint)(fVar273 * fVar273 * 3.0)));
                auVar211 = SUB6416(ZEXT464(0x40000000),0);
                auVar212 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar145,auVar211);
                auVar107 = vfmadd231ss_fma(ZEXT416((uint)(fVar253 * fVar253 * -3.0)),
                                           ZEXT416((uint)(fVar253 + fVar253)),auVar212);
                auVar135 = vfnmadd231ss_fma(ZEXT416((uint)(fVar273 * (fVar253 + fVar253))),
                                            ZEXT416((uint)fVar253),ZEXT416((uint)fVar253));
                auVar212 = vfmadd213ss_fma(ZEXT416((uint)fVar250),auVar145,
                                           ZEXT416((uint)(fVar273 * fVar273)));
                fVar250 = auVar135._0_4_ * 0.5;
                fVar251 = auVar168._0_4_ * 0.5;
                fVar252 = auVar107._0_4_ * 0.5;
                fVar253 = auVar212._0_4_ * 0.5;
                auVar202._0_4_ = fVar191 * fVar253;
                auVar202._4_4_ = fStack_b3c * fVar253;
                auVar202._8_4_ = fStack_b38 * fVar253;
                auVar202._12_4_ = fStack_b34 * fVar253;
                auVar174._4_4_ = fVar252;
                auVar174._0_4_ = fVar252;
                auVar174._8_4_ = fVar252;
                auVar174._12_4_ = fVar252;
                auVar168 = vfmadd213ps_fma(auVar174,auVar9,auVar202);
                auVar142._4_4_ = fVar251;
                auVar142._0_4_ = fVar251;
                auVar142._8_4_ = fVar251;
                auVar142._12_4_ = fVar251;
                auVar168 = vfmadd213ps_fma(auVar142,auVar10,auVar168);
                auVar293._4_4_ = fVar250;
                auVar293._0_4_ = fVar250;
                auVar293._8_4_ = fVar250;
                auVar293._12_4_ = fVar250;
                auVar212 = vfmadd213ps_fma(auVar293,auVar8,auVar168);
                auVar145 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),auVar145,auVar211);
                local_b80 = auVar109._0_4_;
                auVar117._0_4_ = fVar191 * local_b80;
                auVar117._4_4_ = fStack_b3c * local_b80;
                auVar117._8_4_ = fStack_b38 * local_b80;
                auVar117._12_4_ = fStack_b34 * local_b80;
                local_ac0 = auVar136._0_4_;
                auVar175._4_4_ = local_ac0;
                auVar175._0_4_ = local_ac0;
                auVar175._8_4_ = local_ac0;
                auVar175._12_4_ = local_ac0;
                auVar109 = vfmadd213ps_fma(auVar175,auVar9,auVar117);
                uVar102 = auVar108._0_4_;
                auVar203._4_4_ = uVar102;
                auVar203._0_4_ = uVar102;
                auVar203._8_4_ = uVar102;
                auVar203._12_4_ = uVar102;
                auVar109 = vfmadd213ps_fma(auVar203,auVar10,auVar109);
                auVar168 = vdpps_avx(auVar212,auVar212,0x7f);
                auVar143._0_4_ = auVar145._0_4_;
                auVar143._4_4_ = auVar143._0_4_;
                auVar143._8_4_ = auVar143._0_4_;
                auVar143._12_4_ = auVar143._0_4_;
                auVar108 = vfmadd213ps_fma(auVar143,auVar8,auVar109);
                auVar109 = vblendps_avx(auVar168,_DAT_01feba10,0xe);
                auVar136 = vrsqrtss_avx(auVar109,auVar109);
                fVar252 = auVar168._0_4_;
                fVar250 = auVar136._0_4_;
                auVar136 = vdpps_avx(auVar212,auVar108,0x7f);
                fVar250 = fVar250 * 1.5 + fVar252 * -0.5 * fVar250 * fVar250 * fVar250;
                auVar144._0_4_ = auVar108._0_4_ * fVar252;
                auVar144._4_4_ = auVar108._4_4_ * fVar252;
                auVar144._8_4_ = auVar108._8_4_ * fVar252;
                auVar144._12_4_ = auVar108._12_4_ * fVar252;
                fVar251 = auVar136._0_4_;
                auVar228._0_4_ = auVar212._0_4_ * fVar251;
                auVar228._4_4_ = auVar212._4_4_ * fVar251;
                fVar253 = auVar212._8_4_;
                auVar228._8_4_ = fVar253 * fVar251;
                fVar254 = auVar212._12_4_;
                auVar228._12_4_ = fVar254 * fVar251;
                auVar136 = vsubps_avx(auVar144,auVar228);
                auVar109 = vrcpss_avx(auVar109,auVar109);
                auVar108 = vfnmadd213ss_fma(auVar109,auVar168,auVar211);
                fVar251 = auVar109._0_4_ * auVar108._0_4_;
                auVar109 = vmaxss_avx(ZEXT416((uint)local_a20._0_4_),
                                      ZEXT416((uint)(fVar241 * (float)local_800._0_4_)));
                auVar189 = ZEXT1664(auVar109);
                auVar261._0_8_ = auVar212._0_8_ ^ 0x8000000080000000;
                auVar261._8_4_ = -fVar253;
                auVar261._12_4_ = -fVar254;
                auVar204._0_4_ = fVar250 * auVar136._0_4_ * fVar251;
                auVar204._4_4_ = fVar250 * auVar136._4_4_ * fVar251;
                auVar204._8_4_ = fVar250 * auVar136._8_4_ * fVar251;
                auVar204._12_4_ = fVar250 * auVar136._12_4_ * fVar251;
                auVar245._0_4_ = auVar212._0_4_ * fVar250;
                auVar245._4_4_ = auVar212._4_4_ * fVar250;
                auVar245._8_4_ = fVar253 * fVar250;
                auVar245._12_4_ = fVar254 * fVar250;
                if (fVar252 < -fVar252) {
                  fVar250 = sqrtf(fVar252);
                  auVar189 = ZEXT464(auVar109._0_4_);
                  auVar116 = ZEXT416(auVar116._0_4_);
                }
                else {
                  auVar168 = vsqrtss_avx(auVar168,auVar168);
                  fVar250 = auVar168._0_4_;
                }
                auVar168 = vdpps_avx(_local_9e0,auVar245,0x7f);
                auVar107 = vfmadd213ss_fma(ZEXT416((uint)local_a20._0_4_),auVar116,auVar189._0_16_);
                auVar136 = vdpps_avx(auVar261,auVar245,0x7f);
                auVar108 = vdpps_avx(_local_9e0,auVar204,0x7f);
                auVar145 = vdpps_avx(local_9f0,auVar245,0x7f);
                auVar107 = vfmadd213ss_fma(ZEXT416((uint)(auVar116._0_4_ + 1.0)),
                                           ZEXT416((uint)((float)local_a20._0_4_ / fVar250)),
                                           auVar107);
                auVar306 = ZEXT1664(auVar107);
                fVar250 = auVar136._0_4_ + auVar108._0_4_;
                auVar118._0_4_ = auVar168._0_4_ * auVar168._0_4_;
                auVar118._4_4_ = auVar168._4_4_ * auVar168._4_4_;
                auVar118._8_4_ = auVar168._8_4_ * auVar168._8_4_;
                auVar118._12_4_ = auVar168._12_4_ * auVar168._12_4_;
                auVar136 = vdpps_avx(_local_9e0,auVar261,0x7f);
                auVar116 = vsubps_avx(auVar110,auVar118);
                auVar108 = vrsqrtss_avx(auVar116,auVar116);
                fVar252 = auVar116._0_4_;
                fVar251 = auVar108._0_4_;
                fVar251 = fVar251 * 1.5 + fVar252 * -0.5 * fVar251 * fVar251 * fVar251;
                auVar108 = vdpps_avx(_local_9e0,local_9f0,0x7f);
                auVar136 = vfnmadd231ss_fma(auVar136,auVar168,ZEXT416((uint)fVar250));
                auVar269 = ZEXT1664(auVar136);
                auVar108 = vfnmadd231ss_fma(auVar108,auVar168,auVar145);
                if (fVar252 < 0.0) {
                  local_a60._0_16_ = ZEXT416((uint)fVar250);
                  local_820._0_4_ = fVar251;
                  local_840._0_16_ = auVar108;
                  auVar269 = ZEXT1664(auVar136);
                  fVar252 = sqrtf(fVar252);
                  auVar306 = ZEXT464(auVar107._0_4_);
                  auVar189 = ZEXT464(auVar109._0_4_);
                  fVar251 = (float)local_820._0_4_;
                  auVar108 = local_840._0_16_;
                  auVar109 = local_a60._0_16_;
                }
                else {
                  auVar109 = vsqrtss_avx(auVar116,auVar116);
                  fVar252 = auVar109._0_4_;
                  auVar109 = ZEXT416((uint)fVar250);
                }
                auVar300 = ZEXT1664(auVar168);
                auVar107 = vpermilps_avx(local_7c0._0_16_,0xff);
                auVar116 = vshufps_avx(auVar212,auVar212,0xff);
                auVar136 = vfmsub213ss_fma(auVar136,ZEXT416((uint)fVar251),auVar116);
                auVar205._0_8_ = auVar145._0_8_ ^ 0x8000000080000000;
                auVar205._8_4_ = auVar145._8_4_ ^ 0x80000000;
                auVar205._12_4_ = auVar145._12_4_ ^ 0x80000000;
                auVar216._0_8_ = auVar136._0_8_ ^ 0x8000000080000000;
                auVar216._8_4_ = auVar136._8_4_ ^ 0x80000000;
                auVar216._12_4_ = auVar136._12_4_ ^ 0x80000000;
                auVar135 = ZEXT416((uint)(auVar108._0_4_ * fVar251));
                auVar108 = vfmsub231ss_fma(ZEXT416((uint)(auVar136._0_4_ * auVar145._0_4_)),auVar109
                                           ,auVar135);
                auVar136 = vinsertps_avx(auVar135,auVar205,0x10);
                uVar102 = auVar108._0_4_;
                auVar206._4_4_ = uVar102;
                auVar206._0_4_ = uVar102;
                auVar206._8_4_ = uVar102;
                auVar206._12_4_ = uVar102;
                auVar136 = vdivps_avx(auVar136,auVar206);
                auVar145 = ZEXT416((uint)(fVar252 - auVar107._0_4_));
                auVar108 = vinsertps_avx(auVar168,auVar145,0x10);
                auVar176._0_4_ = auVar108._0_4_ * auVar136._0_4_;
                auVar176._4_4_ = auVar108._4_4_ * auVar136._4_4_;
                auVar176._8_4_ = auVar108._8_4_ * auVar136._8_4_;
                auVar176._12_4_ = auVar108._12_4_ * auVar136._12_4_;
                auVar109 = vinsertps_avx(auVar216,auVar109,0x1c);
                auVar109 = vdivps_avx(auVar109,auVar206);
                auVar136 = vhaddps_avx(auVar176,auVar176);
                auVar207._0_4_ = auVar108._0_4_ * auVar109._0_4_;
                auVar207._4_4_ = auVar108._4_4_ * auVar109._4_4_;
                auVar207._8_4_ = auVar108._8_4_ * auVar109._8_4_;
                auVar207._12_4_ = auVar108._12_4_ * auVar109._12_4_;
                auVar109 = vhaddps_avx(auVar207,auVar207);
                fVar273 = fVar273 - auVar136._0_4_;
                fVar241 = fVar241 - auVar109._0_4_;
                auVar285 = ZEXT464((uint)fVar241);
                auVar109 = vandps_avx(auVar168,auVar242);
                bVar55 = true;
                if (auVar109._0_4_ < auVar306._0_4_) {
                  auVar136 = vfmadd231ss_fma(ZEXT416((uint)(auVar189._0_4_ + auVar306._0_4_)),
                                             local_860,ZEXT416(0x36000000));
                  auVar109 = vandps_avx(auVar145,auVar242);
                  auVar217 = SUB6432(ZEXT864(0),0) << 0x20;
                  if (auVar109._0_4_ < auVar136._0_4_) {
                    fVar241 = fVar241 + (float)local_990._0_4_;
                    auVar285 = ZEXT464((uint)fVar241);
                    if ((((fVar133 <= fVar241) &&
                         (fVar250 = *(float *)(ray + k * 4 + 0x100), fVar241 <= fVar250)) &&
                        (0.0 <= fVar273)) && (fVar273 <= 1.0)) {
                      auVar110 = vrsqrtss_avx(auVar110,auVar110);
                      fVar251 = auVar110._0_4_;
                      pGVar3 = (context->scene->geometries).items[uVar96].ptr;
                      if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                          unaff_BL = true;
                        }
                        else {
                          fVar106 = fVar251 * 1.5 + fVar106 * -0.5 * fVar251 * fVar251 * fVar251;
                          auVar146._0_4_ = fVar106 * (float)local_9e0._0_4_;
                          auVar146._4_4_ = fVar106 * (float)local_9e0._4_4_;
                          auVar146._8_4_ = fVar106 * fStack_9d8;
                          auVar146._12_4_ = fVar106 * fStack_9d4;
                          auVar108 = vfmadd213ps_fma(auVar116,auVar146,auVar212);
                          auVar110 = vshufps_avx(auVar146,auVar146,0xc9);
                          auVar109 = vshufps_avx(auVar212,auVar212,0xc9);
                          auVar147._0_4_ = auVar146._0_4_ * auVar109._0_4_;
                          auVar147._4_4_ = auVar146._4_4_ * auVar109._4_4_;
                          auVar147._8_4_ = auVar146._8_4_ * auVar109._8_4_;
                          auVar147._12_4_ = auVar146._12_4_ * auVar109._12_4_;
                          auVar136 = vfmsub231ps_fma(auVar147,auVar212,auVar110);
                          auVar110 = vshufps_avx(auVar136,auVar136,0xc9);
                          auVar109 = vshufps_avx(auVar108,auVar108,0xc9);
                          auVar136 = vshufps_avx(auVar136,auVar136,0xd2);
                          auVar119._0_4_ = auVar108._0_4_ * auVar136._0_4_;
                          auVar119._4_4_ = auVar108._4_4_ * auVar136._4_4_;
                          auVar119._8_4_ = auVar108._8_4_ * auVar136._8_4_;
                          auVar119._12_4_ = auVar108._12_4_ * auVar136._12_4_;
                          auVar109 = vfmsub231ps_fma(auVar119,auVar110,auVar109);
                          auVar163._4_4_ = fVar273;
                          auVar163._0_4_ = fVar273;
                          auVar163._8_4_ = fVar273;
                          auVar163._12_4_ = fVar273;
                          auVar163._16_4_ = fVar273;
                          auVar163._20_4_ = fVar273;
                          auVar163._24_4_ = fVar273;
                          auVar163._28_4_ = fVar273;
                          auVar110 = vmovshdup_avx(auVar109);
                          local_3e0._8_8_ = auVar110._0_8_;
                          auVar110 = vshufps_avx(auVar109,auVar109,0xaa);
                          local_3c0 = auVar110._0_8_;
                          local_3a0 = auVar109._0_4_;
                          local_3e0._0_8_ = local_3e0._8_8_;
                          local_3e0._16_8_ = local_3e0._8_8_;
                          local_3e0._24_8_ = local_3e0._8_8_;
                          uStack_3b8 = local_3c0;
                          uStack_3b0 = local_3c0;
                          uStack_3a8 = local_3c0;
                          uStack_39c = local_3a0;
                          uStack_398 = local_3a0;
                          uStack_394 = local_3a0;
                          uStack_390 = local_3a0;
                          uStack_38c = local_3a0;
                          uStack_388 = local_3a0;
                          uStack_384 = local_3a0;
                          local_380 = auVar163;
                          local_360 = ZEXT832(0) << 0x20;
                          local_340 = CONCAT44(uStack_5fc,local_600);
                          uStack_338 = CONCAT44(uStack_5f4,uStack_5f8);
                          uStack_330 = CONCAT44(uStack_5ec,uStack_5f0);
                          uStack_328 = CONCAT44(uStack_5e4,uStack_5e8);
                          local_320._4_4_ = uStack_5dc;
                          local_320._0_4_ = local_5e0;
                          local_320._8_4_ = uStack_5d8;
                          local_320._12_4_ = uStack_5d4;
                          local_320._16_4_ = uStack_5d0;
                          local_320._20_4_ = uStack_5cc;
                          local_320._24_4_ = uStack_5c8;
                          local_320._28_4_ = uStack_5c4;
                          vpcmpeqd_avx2(local_320,local_320);
                          local_300 = context->user->instID[0];
                          uStack_2fc = local_300;
                          uStack_2f8 = local_300;
                          uStack_2f4 = local_300;
                          uStack_2f0 = local_300;
                          uStack_2ec = local_300;
                          uStack_2e8 = local_300;
                          uStack_2e4 = local_300;
                          local_2e0 = context->user->instPrimID[0];
                          uStack_2dc = local_2e0;
                          uStack_2d8 = local_2e0;
                          uStack_2d4 = local_2e0;
                          uStack_2d0 = local_2e0;
                          uStack_2cc = local_2e0;
                          uStack_2c8 = local_2e0;
                          uStack_2c4 = local_2e0;
                          *(float *)(ray + k * 4 + 0x100) = fVar241;
                          local_9c0 = local_620._0_8_;
                          uStack_9b8 = local_620._8_8_;
                          uStack_9b0 = local_620._16_8_;
                          uStack_9a8 = local_620._24_8_;
                          local_a90.valid = (int *)&local_9c0;
                          local_a90.geometryUserPtr = pGVar3->userPtr;
                          local_a90.context = context->user;
                          local_a90.hit = (RTCHitN *)local_3e0;
                          local_a90.N = 8;
                          local_a90.ray = (RTCRayN *)ray;
                          if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                            auVar269 = ZEXT1664(auVar269._0_16_);
                            auVar300 = ZEXT1664(auVar168);
                            auVar306 = ZEXT1664(auVar306._0_16_);
                            (*pGVar3->occlusionFilterN)(&local_a90);
                            auVar167._8_56_ = extraout_var_03;
                            auVar167._0_8_ = extraout_XMM1_Qa_00;
                            auVar163 = auVar167._0_32_;
                            auVar217 = ZEXT1632(ZEXT816(0) << 0x40);
                          }
                          auVar66._8_8_ = uStack_9b8;
                          auVar66._0_8_ = local_9c0;
                          auVar66._16_8_ = uStack_9b0;
                          auVar66._24_8_ = uStack_9a8;
                          auVar121 = vpcmpeqd_avx2(auVar217,auVar66);
                          auVar11 = vpcmpeqd_avx2(auVar163,auVar163);
                          auVar229 = auVar11 & ~auVar121;
                          if ((((((((auVar229 >> 0x1f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0 &&
                                   (auVar229 >> 0x3f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar229 >> 0x5f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) && SUB321(auVar229 >> 0x7f,0) == '\0') &&
                                (auVar229 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                               && SUB321(auVar229 >> 0xbf,0) == '\0') &&
                              (auVar229 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                              && -1 < auVar229[0x1f]) {
                            auVar121 = auVar121 ^ auVar11;
                          }
                          else {
                            p_Var4 = context->args->filter;
                            if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                              auVar269 = ZEXT1664(auVar269._0_16_);
                              auVar300 = ZEXT1664(auVar300._0_16_);
                              auVar306 = ZEXT1664(auVar306._0_16_);
                              auVar132._0_8_ = (*p_Var4)(&local_a90);
                              auVar132._8_56_ = extraout_var_01;
                              auVar121 = auVar132._0_32_;
                              auVar217 = ZEXT1632(ZEXT816(0) << 0x40);
                            }
                            auVar67._8_8_ = uStack_9b8;
                            auVar67._0_8_ = local_9c0;
                            auVar67._16_8_ = uStack_9b0;
                            auVar67._24_8_ = uStack_9a8;
                            auVar217 = vpcmpeqd_avx2(auVar217,auVar67);
                            auVar121 = vpcmpeqd_avx2(auVar121,auVar121);
                            auVar121 = auVar217 ^ auVar121;
                            auVar188._8_4_ = 0xff800000;
                            auVar188._0_8_ = 0xff800000ff800000;
                            auVar188._12_4_ = 0xff800000;
                            auVar188._16_4_ = 0xff800000;
                            auVar188._20_4_ = 0xff800000;
                            auVar188._24_4_ = 0xff800000;
                            auVar188._28_4_ = 0xff800000;
                            auVar217 = vblendvps_avx(auVar188,*(undefined1 (*) [32])
                                                               (local_a90.ray + 0x100),auVar217);
                            *(undefined1 (*) [32])(local_a90.ray + 0x100) = auVar217;
                          }
                          bVar62 = (auVar121 >> 0x1f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0;
                          bVar63 = (auVar121 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0;
                          bVar61 = (auVar121 >> 0x5f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0;
                          bVar60 = SUB321(auVar121 >> 0x7f,0) != '\0';
                          bVar59 = (auVar121 & (undefined1  [32])0x100000000) !=
                                   (undefined1  [32])0x0;
                          bVar58 = SUB321(auVar121 >> 0xbf,0) != '\0';
                          bVar56 = (auVar121 & (undefined1  [32])0x100000000) !=
                                   (undefined1  [32])0x0;
                          bVar55 = auVar121[0x1f] < '\0';
                          unaff_BL = ((((((bVar62 || bVar63) || bVar61) || bVar60) || bVar59) ||
                                      bVar58) || bVar56) || bVar55;
                          if (((((((!bVar62 && !bVar63) && !bVar61) && !bVar60) && !bVar59) &&
                               !bVar58) && !bVar56) && !bVar55) {
                            *(float *)(ray + k * 4 + 0x100) = fVar250;
                          }
                        }
                        auVar285 = ZEXT464((uint)fVar241);
                        bVar55 = false;
                        goto LAB_016c2805;
                      }
                    }
                    bVar55 = false;
                    unaff_BL = 0;
                  }
                }
LAB_016c2805:
                if (!bVar55) goto LAB_016c2b12;
                lVar100 = lVar100 + -1;
              } while (lVar100 != 0);
              unaff_BL = 0;
LAB_016c2b12:
              unaff_BL = unaff_BL & 1;
              uVar104 = CONCAT71(local_880._1_7_,local_880[0] | unaff_BL);
              uVar102 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar129._4_4_ = uVar102;
              auVar129._0_4_ = uVar102;
              auVar129._8_4_ = uVar102;
              auVar129._12_4_ = uVar102;
              auVar129._16_4_ = uVar102;
              auVar129._20_4_ = uVar102;
              auVar129._24_4_ = uVar102;
              auVar129._28_4_ = uVar102;
              auVar229 = vcmpps_avx(_local_920,auVar129,2);
              auVar217 = vandps_avx(auVar229,local_780);
              local_780 = local_780 & auVar229;
              uVar103 = local_7a0;
            } while ((((((((local_780 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (local_780 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (local_780 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(local_780 >> 0x7f,0) != '\0') ||
                       (local_780 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(local_780 >> 0xbf,0) != '\0') ||
                     (local_780 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     local_780[0x1f] < '\0');
          }
          auVar164._0_4_ = fVar134 + local_420._0_4_;
          auVar164._4_4_ = fVar134 + local_420._4_4_;
          auVar164._8_4_ = fVar134 + local_420._8_4_;
          auVar164._12_4_ = fVar134 + local_420._12_4_;
          auVar164._16_4_ = fVar134 + local_420._16_4_;
          auVar164._20_4_ = fVar134 + local_420._20_4_;
          auVar164._24_4_ = fVar134 + local_420._24_4_;
          auVar164._28_4_ = fVar134 + local_420._28_4_;
          uVar102 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar210._4_4_ = uVar102;
          auVar210._0_4_ = uVar102;
          auVar210._8_4_ = uVar102;
          auVar210._12_4_ = uVar102;
          auVar210._16_4_ = uVar102;
          auVar210._20_4_ = uVar102;
          auVar210._24_4_ = uVar102;
          auVar210._28_4_ = uVar102;
          auVar229 = vcmpps_avx(auVar164,auVar210,2);
          auVar217 = vandps_avx(local_6c0,local_6a0);
          auVar217 = vandps_avx(auVar229,auVar217);
          auVar218._0_4_ = fVar134 + local_2c0._0_4_;
          auVar218._4_4_ = fVar134 + local_2c0._4_4_;
          auVar218._8_4_ = fVar134 + local_2c0._8_4_;
          auVar218._12_4_ = fVar134 + local_2c0._12_4_;
          auVar218._16_4_ = fVar134 + local_2c0._16_4_;
          auVar218._20_4_ = fVar134 + local_2c0._20_4_;
          auVar218._24_4_ = fVar134 + local_2c0._24_4_;
          auVar218._28_4_ = fVar134 + local_2c0._28_4_;
          auVar121 = vcmpps_avx(auVar218,auVar210,2);
          auVar229 = vandps_avx(_local_960,local_940);
          auVar229 = vandps_avx(auVar121,auVar229);
          auVar229 = vorps_avx(auVar217,auVar229);
          if ((((((((auVar229 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar229 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar229 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar229 >> 0x7f,0) != '\0') ||
                (auVar229 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar229 >> 0xbf,0) != '\0') ||
              (auVar229 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar229[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar99 * 0x60) = auVar229;
            auVar217 = vblendvps_avx(_local_2c0,local_420,auVar217);
            *(undefined1 (*) [32])(auStack_160 + uVar99 * 0x60) = auVar217;
            uVar1 = vmovlps_avx(local_980);
            *(undefined8 *)(afStack_140 + uVar99 * 0x18) = uVar1;
            auStack_138[uVar99 * 0x18] = (int)uVar103 + 1;
            uVar99 = (ulong)((int)uVar99 + 1);
          }
        }
      }
    }
    do {
      if ((int)uVar99 == 0) {
        if ((uVar104 & 1) != 0) {
          return local_ca9;
        }
        uVar102 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar120._4_4_ = uVar102;
        auVar120._0_4_ = uVar102;
        auVar120._8_4_ = uVar102;
        auVar120._12_4_ = uVar102;
        auVar5 = vcmpps_avx(local_630,auVar120,2);
        uVar96 = vmovmskps_avx(auVar5);
        uVar96 = (uint)local_968 & uVar96;
        local_ca9 = uVar96 != 0;
        if (!local_ca9) {
          return local_ca9;
        }
        goto LAB_016c02da;
      }
      uVar98 = (ulong)((int)uVar99 - 1);
      lVar100 = uVar98 * 0x60;
      auVar217 = *(undefined1 (*) [32])(auStack_160 + lVar100);
      auVar126._0_4_ = fVar134 + auVar217._0_4_;
      auVar126._4_4_ = fVar134 + auVar217._4_4_;
      auVar126._8_4_ = fVar134 + auVar217._8_4_;
      auVar126._12_4_ = fVar134 + auVar217._12_4_;
      auVar126._16_4_ = fVar134 + auVar217._16_4_;
      auVar126._20_4_ = fVar134 + auVar217._20_4_;
      auVar126._24_4_ = fVar134 + auVar217._24_4_;
      auVar126._28_4_ = fVar134 + auVar217._28_4_;
      uVar102 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar209._4_4_ = uVar102;
      auVar209._0_4_ = uVar102;
      auVar209._8_4_ = uVar102;
      auVar209._12_4_ = uVar102;
      auVar209._16_4_ = uVar102;
      auVar209._20_4_ = uVar102;
      auVar209._24_4_ = uVar102;
      auVar209._28_4_ = uVar102;
      auVar121 = vcmpps_avx(auVar126,auVar209,2);
      auVar229 = vandps_avx(auVar121,*(undefined1 (*) [32])(auStack_180 + lVar100));
      local_3e0 = auVar229;
      auVar121 = *(undefined1 (*) [32])(auStack_180 + lVar100) & auVar121;
      bVar62 = (auVar121 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar63 = (auVar121 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar61 = (auVar121 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar60 = SUB321(auVar121 >> 0x7f,0) == '\0';
      bVar59 = (auVar121 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar58 = SUB321(auVar121 >> 0xbf,0) == '\0';
      bVar56 = (auVar121 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar55 = -1 < auVar121[0x1f];
      if (((((((!bVar62 || !bVar63) || !bVar61) || !bVar60) || !bVar59) || !bVar58) || !bVar56) ||
          !bVar55) {
        auVar183._8_4_ = 0x7f800000;
        auVar183._0_8_ = 0x7f8000007f800000;
        auVar183._12_4_ = 0x7f800000;
        auVar183._16_4_ = 0x7f800000;
        auVar183._20_4_ = 0x7f800000;
        auVar183._24_4_ = 0x7f800000;
        auVar183._28_4_ = 0x7f800000;
        auVar217 = vblendvps_avx(auVar183,auVar217,auVar229);
        auVar121 = vshufps_avx(auVar217,auVar217,0xb1);
        auVar121 = vminps_avx(auVar217,auVar121);
        auVar11 = vshufpd_avx(auVar121,auVar121,5);
        auVar121 = vminps_avx(auVar121,auVar11);
        auVar11 = vpermpd_avx2(auVar121,0x4e);
        auVar121 = vminps_avx(auVar121,auVar11);
        auVar217 = vcmpps_avx(auVar217,auVar121,0);
        auVar121 = auVar229 & auVar217;
        if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar121 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar121 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar121 >> 0x7f,0) != '\0') ||
              (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar121 >> 0xbf,0) != '\0') ||
            (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar121[0x1f] < '\0') {
          auVar229 = vandps_avx(auVar217,auVar229);
        }
        fVar273 = afStack_140[uVar98 * 0x18 + 1];
        uVar103 = (ulong)auStack_138[uVar98 * 0x18];
        uVar101 = vmovmskps_avx(auVar229);
        iVar97 = 0;
        for (; (uVar101 & 1) == 0; uVar101 = uVar101 >> 1 | 0x80000000) {
          iVar97 = iVar97 + 1;
        }
        fVar241 = afStack_140[uVar98 * 0x18];
        auVar127._4_4_ = fVar241;
        auVar127._0_4_ = fVar241;
        auVar127._8_4_ = fVar241;
        auVar127._12_4_ = fVar241;
        auVar127._16_4_ = fVar241;
        auVar127._20_4_ = fVar241;
        auVar127._24_4_ = fVar241;
        auVar127._28_4_ = fVar241;
        *(undefined4 *)(local_3e0 + (uint)(iVar97 << 2)) = 0;
        *(undefined1 (*) [32])(auStack_180 + lVar100) = local_3e0;
        if ((((((((local_3e0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (local_3e0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (local_3e0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(local_3e0 >> 0x7f,0) != '\0') ||
              (local_3e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(local_3e0 >> 0xbf,0) != '\0') ||
            (local_3e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            local_3e0[0x1f] < '\0') {
          uVar98 = uVar99;
        }
        fVar273 = fVar273 - fVar241;
        auVar154._4_4_ = fVar273;
        auVar154._0_4_ = fVar273;
        auVar154._8_4_ = fVar273;
        auVar154._12_4_ = fVar273;
        auVar154._16_4_ = fVar273;
        auVar154._20_4_ = fVar273;
        auVar154._24_4_ = fVar273;
        auVar154._28_4_ = fVar273;
        auVar110 = vfmadd132ps_fma(auVar154,auVar127,_DAT_02020f20);
        local_420 = ZEXT1632(auVar110);
        local_980._8_8_ = 0;
        local_980._0_8_ = *(ulong *)(local_420 + (uint)(iVar97 << 2));
      }
      uVar99 = uVar98;
      fVar273 = fVar134;
    } while (((((((bVar62 && bVar63) && bVar61) && bVar60) && bVar59) && bVar58) && bVar56) &&
             bVar55);
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }